

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersector1<8>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  ulong uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  uint uVar97;
  uint uVar98;
  ulong uVar99;
  ulong uVar100;
  long lVar101;
  uint uVar102;
  ulong uVar103;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined4 uVar104;
  undefined8 unaff_R12;
  ulong uVar105;
  bool bVar106;
  float fVar107;
  undefined8 uVar109;
  float fVar140;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar139;
  float fVar141;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined4 uVar108;
  undefined1 auVar112 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar159;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar213;
  float fVar215;
  float fVar217;
  undefined1 auVar208 [32];
  float fVar212;
  float fVar214;
  float fVar216;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  float fVar236;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [28];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar250 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar249;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  float fVar258;
  undefined1 auVar254 [32];
  float fVar256;
  float fVar257;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 in_ZMM9 [64];
  undefined1 auVar255 [64];
  undefined1 auVar262 [16];
  float fVar267;
  undefined1 auVar264 [32];
  undefined1 auVar263 [16];
  undefined1 auVar265 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar266 [64];
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar278;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b2c;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  RTCFilterFunctionNArguments local_ab8;
  int local_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined8 local_9b0;
  float local_9a8;
  float local_9a4;
  undefined4 local_9a0;
  uint local_99c;
  uint local_998;
  uint local_994;
  uint local_990;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  float local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [16];
  Primitive *local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar268 [32];
  
  PVar8 = prim[1];
  uVar99 = (ulong)(byte)PVar8;
  fVar199 = *(float *)(prim + uVar99 * 0x19 + 0x12);
  auVar250 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar99 * 0x19 + 6));
  auVar110._0_4_ = fVar199 * auVar250._0_4_;
  auVar110._4_4_ = fVar199 * auVar250._4_4_;
  auVar110._8_4_ = fVar199 * auVar250._8_4_;
  auVar110._12_4_ = fVar199 * auVar250._12_4_;
  auVar218._0_4_ = fVar199 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar218._4_4_ = fVar199 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar218._8_4_ = fVar199 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar218._12_4_ = fVar199 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + uVar99 * 4 + 6);
  auVar122 = vpmovsxbd_avx2(auVar250);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar99 * 5 + 6);
  auVar126 = vpmovsxbd_avx2(auVar3);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar99 * 6 + 6);
  auVar273 = vpmovsxbd_avx2(auVar4);
  auVar273 = vcvtdq2ps_avx(auVar273);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar99 * 0xb + 6);
  auVar11 = vpmovsxbd_avx2(auVar114);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar275._8_8_ = 0;
  auVar275._0_8_ = *(ulong *)(prim + uVar99 * 0xc + 6);
  auVar133 = vpmovsxbd_avx2(auVar275);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar99 * 0xd + 6);
  auVar233 = vpmovsxbd_avx2(auVar5);
  auVar233 = vcvtdq2ps_avx(auVar233);
  auVar274 = ZEXT3264(auVar233);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar99 * 0x12 + 6);
  auVar170 = vpmovsxbd_avx2(auVar6);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar99 * 0x13 + 6);
  auVar12 = vpmovsxbd_avx2(auVar7);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + uVar99 * 0x14 + 6);
  auVar13 = vpmovsxbd_avx2(auVar163);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar279._4_4_ = auVar218._0_4_;
  auVar279._0_4_ = auVar218._0_4_;
  auVar279._8_4_ = auVar218._0_4_;
  auVar279._12_4_ = auVar218._0_4_;
  auVar279._16_4_ = auVar218._0_4_;
  auVar279._20_4_ = auVar218._0_4_;
  auVar279._24_4_ = auVar218._0_4_;
  auVar279._28_4_ = auVar218._0_4_;
  auVar250 = vmovshdup_avx(auVar218);
  uVar109 = auVar250._0_8_;
  auVar286._8_8_ = uVar109;
  auVar286._0_8_ = uVar109;
  auVar286._16_8_ = uVar109;
  auVar286._24_8_ = uVar109;
  auVar250 = vshufps_avx(auVar218,auVar218,0xaa);
  fVar199 = auVar250._0_4_;
  auVar270._0_4_ = fVar199 * auVar273._0_4_;
  fVar211 = auVar250._4_4_;
  auVar270._4_4_ = fVar211 * auVar273._4_4_;
  auVar270._8_4_ = fVar199 * auVar273._8_4_;
  auVar270._12_4_ = fVar211 * auVar273._12_4_;
  auVar270._16_4_ = fVar199 * auVar273._16_4_;
  auVar270._20_4_ = fVar211 * auVar273._20_4_;
  auVar270._28_36_ = in_ZMM10._28_36_;
  auVar270._24_4_ = fVar199 * auVar273._24_4_;
  auVar266._0_4_ = auVar233._0_4_ * fVar199;
  auVar266._4_4_ = auVar233._4_4_ * fVar211;
  auVar266._8_4_ = auVar233._8_4_ * fVar199;
  auVar266._12_4_ = auVar233._12_4_ * fVar211;
  auVar266._16_4_ = auVar233._16_4_ * fVar199;
  auVar266._20_4_ = auVar233._20_4_ * fVar211;
  auVar266._28_36_ = in_ZMM9._28_36_;
  auVar266._24_4_ = auVar233._24_4_ * fVar199;
  auVar245._0_4_ = auVar13._0_4_ * fVar199;
  auVar245._4_4_ = auVar13._4_4_ * fVar211;
  auVar245._8_4_ = auVar13._8_4_ * fVar199;
  auVar245._12_4_ = auVar13._12_4_ * fVar211;
  auVar245._16_4_ = auVar13._16_4_ * fVar199;
  auVar245._20_4_ = auVar13._20_4_ * fVar211;
  auVar245._24_4_ = auVar13._24_4_ * fVar199;
  auVar245._28_4_ = 0;
  auVar250 = vfmadd231ps_fma(auVar270._0_32_,auVar286,auVar126);
  auVar3 = vfmadd231ps_fma(auVar266._0_32_,auVar286,auVar133);
  auVar4 = vfmadd231ps_fma(auVar245,auVar12,auVar286);
  auVar114 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar279,auVar122);
  auVar266 = ZEXT1664(auVar114);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar279,auVar11);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar170,auVar279);
  auVar280._4_4_ = auVar110._0_4_;
  auVar280._0_4_ = auVar110._0_4_;
  auVar280._8_4_ = auVar110._0_4_;
  auVar280._12_4_ = auVar110._0_4_;
  auVar280._16_4_ = auVar110._0_4_;
  auVar280._20_4_ = auVar110._0_4_;
  auVar280._24_4_ = auVar110._0_4_;
  auVar280._28_4_ = auVar110._0_4_;
  auVar250 = vmovshdup_avx(auVar110);
  uVar109 = auVar250._0_8_;
  auVar287._8_8_ = uVar109;
  auVar287._0_8_ = uVar109;
  auVar287._16_8_ = uVar109;
  auVar287._24_8_ = uVar109;
  auVar250 = vshufps_avx(auVar110,auVar110,0xaa);
  fVar199 = auVar250._0_4_;
  auVar225._0_4_ = fVar199 * auVar273._0_4_;
  fVar211 = auVar250._4_4_;
  auVar225._4_4_ = fVar211 * auVar273._4_4_;
  auVar225._8_4_ = fVar199 * auVar273._8_4_;
  auVar225._12_4_ = fVar211 * auVar273._12_4_;
  auVar225._16_4_ = fVar199 * auVar273._16_4_;
  auVar225._20_4_ = fVar211 * auVar273._20_4_;
  auVar225._24_4_ = fVar199 * auVar273._24_4_;
  auVar225._28_4_ = 0;
  auVar16._4_4_ = auVar233._4_4_ * fVar211;
  auVar16._0_4_ = auVar233._0_4_ * fVar199;
  auVar16._8_4_ = auVar233._8_4_ * fVar199;
  auVar16._12_4_ = auVar233._12_4_ * fVar211;
  auVar16._16_4_ = auVar233._16_4_ * fVar199;
  auVar16._20_4_ = auVar233._20_4_ * fVar211;
  auVar16._24_4_ = auVar233._24_4_ * fVar199;
  auVar16._28_4_ = auVar273._28_4_;
  auVar273._4_4_ = auVar13._4_4_ * fVar211;
  auVar273._0_4_ = auVar13._0_4_ * fVar199;
  auVar273._8_4_ = auVar13._8_4_ * fVar199;
  auVar273._12_4_ = auVar13._12_4_ * fVar211;
  auVar273._16_4_ = auVar13._16_4_ * fVar199;
  auVar273._20_4_ = auVar13._20_4_ * fVar211;
  auVar273._24_4_ = auVar13._24_4_ * fVar199;
  auVar273._28_4_ = fVar211;
  auVar250 = vfmadd231ps_fma(auVar225,auVar287,auVar126);
  auVar275 = vfmadd231ps_fma(auVar16,auVar287,auVar133);
  auVar5 = vfmadd231ps_fma(auVar273,auVar287,auVar12);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar280,auVar122);
  auVar275 = vfmadd231ps_fma(ZEXT1632(auVar275),auVar280,auVar11);
  local_720._8_4_ = 0x7fffffff;
  local_720._0_8_ = 0x7fffffff7fffffff;
  local_720._12_4_ = 0x7fffffff;
  local_720._16_4_ = 0x7fffffff;
  local_720._20_4_ = 0x7fffffff;
  local_720._24_4_ = 0x7fffffff;
  local_720._28_4_ = 0x7fffffff;
  auVar268._8_4_ = 0x219392ef;
  auVar268._0_8_ = 0x219392ef219392ef;
  auVar268._12_4_ = 0x219392ef;
  auVar268._16_4_ = 0x219392ef;
  auVar268._20_4_ = 0x219392ef;
  auVar268._24_4_ = 0x219392ef;
  auVar268._28_4_ = 0x219392ef;
  auVar270 = ZEXT3264(auVar268);
  auVar122 = vandps_avx(ZEXT1632(auVar114),local_720);
  auVar122 = vcmpps_avx(auVar122,auVar268,1);
  auVar126 = vblendvps_avx(ZEXT1632(auVar114),auVar268,auVar122);
  auVar122 = vandps_avx(ZEXT1632(auVar3),local_720);
  auVar122 = vcmpps_avx(auVar122,auVar268,1);
  auVar273 = vblendvps_avx(ZEXT1632(auVar3),auVar268,auVar122);
  auVar122 = vandps_avx(ZEXT1632(auVar4),local_720);
  auVar122 = vcmpps_avx(auVar122,auVar268,1);
  auVar122 = vblendvps_avx(ZEXT1632(auVar4),auVar268,auVar122);
  auVar114 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar280,auVar170);
  auVar11 = vrcpps_avx(auVar126);
  auVar239._8_4_ = 0x3f800000;
  auVar239._0_8_ = 0x3f8000003f800000;
  auVar239._12_4_ = 0x3f800000;
  auVar239._16_4_ = 0x3f800000;
  auVar239._20_4_ = 0x3f800000;
  auVar239._24_4_ = 0x3f800000;
  auVar239._28_4_ = 0x3f800000;
  auVar250 = vfnmadd213ps_fma(auVar126,auVar11,auVar239);
  auVar250 = vfmadd132ps_fma(ZEXT1632(auVar250),auVar11,auVar11);
  auVar126 = vrcpps_avx(auVar273);
  auVar3 = vfnmadd213ps_fma(auVar273,auVar126,auVar239);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar126,auVar126);
  auVar126 = vrcpps_avx(auVar122);
  auVar4 = vfnmadd213ps_fma(auVar122,auVar126,auVar239);
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 7 + 6));
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar126,auVar126);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar6));
  auVar11._4_4_ = auVar250._4_4_ * auVar122._4_4_;
  auVar11._0_4_ = auVar250._0_4_ * auVar122._0_4_;
  auVar11._8_4_ = auVar250._8_4_ * auVar122._8_4_;
  auVar11._12_4_ = auVar250._12_4_ * auVar122._12_4_;
  auVar11._16_4_ = auVar122._16_4_ * 0.0;
  auVar11._20_4_ = auVar122._20_4_ * 0.0;
  auVar11._24_4_ = auVar122._24_4_ * 0.0;
  auVar11._28_4_ = auVar122._28_4_;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 9 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar6));
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0xe + 6));
  auVar133._4_4_ = auVar250._4_4_ * auVar122._4_4_;
  auVar133._0_4_ = auVar250._0_4_ * auVar122._0_4_;
  auVar133._8_4_ = auVar250._8_4_ * auVar122._8_4_;
  auVar133._12_4_ = auVar250._12_4_ * auVar122._12_4_;
  auVar133._16_4_ = auVar122._16_4_ * 0.0;
  auVar133._20_4_ = auVar122._20_4_ * 0.0;
  auVar133._24_4_ = auVar122._24_4_ * 0.0;
  auVar133._28_4_ = auVar122._28_4_;
  auVar122 = vcvtdq2ps_avx(auVar126);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar275));
  auVar233._4_4_ = auVar3._4_4_ * auVar122._4_4_;
  auVar233._0_4_ = auVar3._0_4_ * auVar122._0_4_;
  auVar233._8_4_ = auVar3._8_4_ * auVar122._8_4_;
  auVar233._12_4_ = auVar3._12_4_ * auVar122._12_4_;
  auVar233._16_4_ = auVar122._16_4_ * 0.0;
  auVar233._20_4_ = auVar122._20_4_ * 0.0;
  auVar233._24_4_ = auVar122._24_4_ * 0.0;
  auVar233._28_4_ = auVar122._28_4_;
  auVar124._1_3_ = 0;
  auVar124[0] = PVar8;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar275));
  auVar170._4_4_ = auVar3._4_4_ * auVar122._4_4_;
  auVar170._0_4_ = auVar3._0_4_ * auVar122._0_4_;
  auVar170._8_4_ = auVar3._8_4_ * auVar122._8_4_;
  auVar170._12_4_ = auVar3._12_4_ * auVar122._12_4_;
  auVar170._16_4_ = auVar122._16_4_ * 0.0;
  auVar170._20_4_ = auVar122._20_4_ * 0.0;
  auVar170._24_4_ = auVar122._24_4_ * 0.0;
  auVar170._28_4_ = auVar122._28_4_;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x15 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar114));
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x17 + 6));
  auVar12._4_4_ = auVar122._4_4_ * auVar4._4_4_;
  auVar12._0_4_ = auVar122._0_4_ * auVar4._0_4_;
  auVar12._8_4_ = auVar122._8_4_ * auVar4._8_4_;
  auVar12._12_4_ = auVar122._12_4_ * auVar4._12_4_;
  auVar12._16_4_ = auVar122._16_4_ * 0.0;
  auVar12._20_4_ = auVar122._20_4_ * 0.0;
  auVar12._24_4_ = auVar122._24_4_ * 0.0;
  auVar12._28_4_ = auVar122._28_4_;
  auVar122 = vcvtdq2ps_avx(auVar126);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar114));
  auVar13._4_4_ = auVar4._4_4_ * auVar122._4_4_;
  auVar13._0_4_ = auVar4._0_4_ * auVar122._0_4_;
  auVar13._8_4_ = auVar4._8_4_ * auVar122._8_4_;
  auVar13._12_4_ = auVar4._12_4_ * auVar122._12_4_;
  auVar13._16_4_ = auVar122._16_4_ * 0.0;
  auVar13._20_4_ = auVar122._20_4_ * 0.0;
  auVar13._24_4_ = auVar122._24_4_ * 0.0;
  auVar13._28_4_ = auVar122._28_4_;
  auVar122 = vpminsd_avx2(auVar11,auVar133);
  auVar126 = vpminsd_avx2(auVar233,auVar170);
  auVar122 = vmaxps_avx(auVar122,auVar126);
  auVar126 = vpminsd_avx2(auVar12,auVar13);
  uVar104 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar253._4_4_ = uVar104;
  auVar253._0_4_ = uVar104;
  auVar253._8_4_ = uVar104;
  auVar253._12_4_ = uVar104;
  auVar253._16_4_ = uVar104;
  auVar253._20_4_ = uVar104;
  auVar253._24_4_ = uVar104;
  auVar253._28_4_ = uVar104;
  auVar126 = vmaxps_avx(auVar126,auVar253);
  auVar122 = vmaxps_avx(auVar122,auVar126);
  local_340._4_4_ = auVar122._4_4_ * 0.99999964;
  local_340._0_4_ = auVar122._0_4_ * 0.99999964;
  local_340._8_4_ = auVar122._8_4_ * 0.99999964;
  local_340._12_4_ = auVar122._12_4_ * 0.99999964;
  local_340._16_4_ = auVar122._16_4_ * 0.99999964;
  local_340._20_4_ = auVar122._20_4_ * 0.99999964;
  local_340._24_4_ = auVar122._24_4_ * 0.99999964;
  local_340._28_4_ = 0x3f7ffffa;
  auVar122 = vpmaxsd_avx2(auVar11,auVar133);
  auVar126 = vpmaxsd_avx2(auVar233,auVar170);
  auVar122 = vminps_avx(auVar122,auVar126);
  fVar199 = (ray->super_RayK<1>).tfar;
  auVar127._4_4_ = fVar199;
  auVar127._0_4_ = fVar199;
  auVar127._8_4_ = fVar199;
  auVar127._12_4_ = fVar199;
  auVar127._16_4_ = fVar199;
  auVar127._20_4_ = fVar199;
  auVar127._24_4_ = fVar199;
  auVar127._28_4_ = fVar199;
  auVar126 = vpmaxsd_avx2(auVar12,auVar13);
  auVar126 = vminps_avx(auVar126,auVar127);
  auVar122 = vminps_avx(auVar122,auVar126);
  auVar126._4_4_ = auVar122._4_4_ * 1.0000004;
  auVar126._0_4_ = auVar122._0_4_ * 1.0000004;
  auVar126._8_4_ = auVar122._8_4_ * 1.0000004;
  auVar126._12_4_ = auVar122._12_4_ * 1.0000004;
  auVar126._16_4_ = auVar122._16_4_ * 1.0000004;
  auVar126._20_4_ = auVar122._20_4_ * 1.0000004;
  auVar126._24_4_ = auVar122._24_4_ * 1.0000004;
  auVar126._28_4_ = auVar122._28_4_;
  auVar124[4] = PVar8;
  auVar124._5_3_ = 0;
  auVar124[8] = PVar8;
  auVar124._9_3_ = 0;
  auVar124[0xc] = PVar8;
  auVar124._13_3_ = 0;
  auVar124[0x10] = PVar8;
  auVar124._17_3_ = 0;
  auVar124[0x14] = PVar8;
  auVar124._21_3_ = 0;
  auVar124[0x18] = PVar8;
  auVar124._25_3_ = 0;
  auVar124[0x1c] = PVar8;
  auVar124._29_3_ = 0;
  auVar122 = vcmpps_avx(local_340,auVar126,2);
  auVar126 = vpcmpgtd_avx2(auVar124,_DAT_01fb4ba0);
  auVar122 = vandps_avx(auVar122,auVar126);
  uVar104 = vmovmskps_avx(auVar122);
  uVar105 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar104);
  auVar122._16_16_ = mm_lookupmask_ps._240_16_;
  auVar122._0_16_ = mm_lookupmask_ps._240_16_;
  local_6e0 = vblendps_avx(auVar122,ZEXT832(0) << 0x20,0x80);
  local_848 = prim;
LAB_012e5787:
  if (uVar105 == 0) {
    return;
  }
  lVar101 = 0;
  for (uVar100 = uVar105; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
    lVar101 = lVar101 + 1;
  }
  uVar105 = uVar105 - 1 & uVar105;
  uVar104 = *(undefined4 *)(local_848 + lVar101 * 4 + 6);
  uVar100 = (ulong)(uint)((int)lVar101 << 6);
  auVar250 = *(undefined1 (*) [16])(prim + uVar100 + uVar99 * 0x19 + 0x16);
  if (uVar105 != 0) {
    uVar103 = uVar105 - 1 & uVar105;
    for (uVar15 = uVar105; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
    }
    if (uVar103 != 0) {
      for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar3 = *(undefined1 (*) [16])(prim + uVar100 + uVar99 * 0x19 + 0x26);
  auVar4 = *(undefined1 (*) [16])(prim + uVar100 + uVar99 * 0x19 + 0x36);
  auVar114 = *(undefined1 (*) [16])(prim + uVar100 + uVar99 * 0x19 + 0x46);
  auVar219._0_4_ = (auVar250._0_4_ + auVar3._0_4_ + auVar4._0_4_ + auVar114._0_4_) * 0.25;
  auVar219._4_4_ = (auVar250._4_4_ + auVar3._4_4_ + auVar4._4_4_ + auVar114._4_4_) * 0.25;
  auVar219._8_4_ = (auVar250._8_4_ + auVar3._8_4_ + auVar4._8_4_ + auVar114._8_4_) * 0.25;
  auVar219._12_4_ = (auVar250._12_4_ + auVar3._12_4_ + auVar4._12_4_ + auVar114._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar275 = vsubps_avx(auVar219,(undefined1  [16])aVar1);
  auVar275 = vdpps_avx(auVar275,(undefined1  [16])aVar2,0x7f);
  auVar5 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  uVar98 = *(uint *)(local_848 + 2);
  auVar6 = vrcpss_avx(auVar5,auVar5);
  auVar5 = vfnmadd213ss_fma(auVar6,auVar5,ZEXT416(0x40000000));
  auVar255 = ZEXT1664(auVar5);
  fVar199 = auVar6._0_4_ * auVar5._0_4_;
  auVar243 = ZEXT464((uint)fVar199);
  fVar199 = auVar275._0_4_ * fVar199;
  local_860 = ZEXT416((uint)fVar199);
  auVar220._4_4_ = fVar199;
  auVar220._0_4_ = fVar199;
  auVar220._8_4_ = fVar199;
  auVar220._12_4_ = fVar199;
  local_840._16_4_ = fVar199;
  local_840._0_16_ = auVar220;
  local_840._20_4_ = fVar199;
  local_840._24_4_ = fVar199;
  local_840._28_4_ = fVar199;
  auVar275 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar220);
  auVar275 = vblendps_avx(auVar275,_DAT_01f45a50,8);
  local_a10 = vsubps_avx(auVar250,auVar275);
  local_a20 = vsubps_avx(auVar4,auVar275);
  local_a30 = vsubps_avx(auVar3,auVar275);
  _local_a40 = vsubps_avx(auVar114,auVar275);
  auVar250 = vmovshdup_avx(local_a10);
  local_400 = auVar250._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar250 = vshufps_avx(local_a10,local_a10,0xaa);
  local_1e0 = auVar250._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar3 = vshufps_avx(local_a10,local_a10,0xff);
  uVar109 = auVar3._0_8_;
  auVar288._8_8_ = uVar109;
  auVar288._0_8_ = uVar109;
  auVar288._16_8_ = uVar109;
  auVar288._24_8_ = uVar109;
  auVar250 = vmovshdup_avx(local_a30);
  local_200 = auVar250._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar250 = vshufps_avx(local_a30,local_a30,0xaa);
  local_420 = auVar250._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar250 = vshufps_avx(local_a30,local_a30,0xff);
  local_220 = auVar250._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar250 = vmovshdup_avx(local_a20);
  local_440 = auVar250._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar250 = vshufps_avx(local_a20,local_a20,0xaa);
  local_460 = auVar250._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar250 = vshufps_avx(local_a20,local_a20,0xff);
  local_480 = auVar250._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar250 = vmovshdup_avx(_local_a40);
  local_4a0 = auVar250._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar250 = vshufps_avx(_local_a40,_local_a40,0xaa);
  local_4c0 = auVar250._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar250 = vshufps_avx(_local_a40,_local_a40,0xff);
  local_4e0 = auVar250._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar111._0_4_ = aVar2.x * aVar2.x;
  auVar111._4_4_ = aVar2.y * aVar2.y;
  auVar111._8_4_ = aVar2.z * aVar2.z;
  auVar111._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar250 = vshufps_avx(auVar111,auVar111,0xaa);
  auVar123._0_8_ = auVar250._0_8_;
  auVar123._8_8_ = auVar123._0_8_;
  auVar123._16_8_ = auVar123._0_8_;
  auVar123._24_8_ = auVar123._0_8_;
  uVar108 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_600._4_4_ = uVar108;
  local_600._0_4_ = uVar108;
  local_600._8_4_ = uVar108;
  local_600._12_4_ = uVar108;
  local_600._16_4_ = uVar108;
  local_600._20_4_ = uVar108;
  local_600._24_4_ = uVar108;
  local_600._28_4_ = uVar108;
  uVar108 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_620._4_4_ = uVar108;
  local_620._0_4_ = uVar108;
  fStack_618 = (float)uVar108;
  fStack_614 = (float)uVar108;
  fStack_610 = (float)uVar108;
  fStack_60c = (float)uVar108;
  fStack_608 = (float)uVar108;
  register0x0000135c = uVar108;
  auVar231 = ZEXT3264(_local_620);
  auVar250 = vfmadd231ps_fma(auVar123,_local_620,_local_620);
  auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),local_600,local_600);
  uVar100 = 0;
  local_b2c = 1;
  local_640 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_63c = local_640;
  fStack_638 = local_640;
  fStack_634 = local_640;
  fStack_630 = local_640;
  fStack_62c = local_640;
  fStack_628 = local_640;
  fStack_624 = local_640;
  local_260 = local_a10._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_280 = local_a30._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_500 = local_a20._0_4_;
  uStack_4fc = local_500;
  uStack_4f8 = local_500;
  uStack_4f4 = local_500;
  uStack_4f0 = local_500;
  uStack_4ec = local_500;
  uStack_4e8 = local_500;
  uStack_4e4 = local_500;
  local_520 = local_a40._0_4_;
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_240 = ZEXT1632(auVar250);
  local_540 = vandps_avx(ZEXT1632(auVar250),local_720);
  local_5d0 = ZEXT816(0x3f80000000000000);
  do {
    auVar194._8_4_ = 0x3f800000;
    auVar194._0_8_ = 0x3f8000003f800000;
    auVar194._12_4_ = 0x3f800000;
    auVar194._16_4_ = 0x3f800000;
    auVar194._20_4_ = 0x3f800000;
    auVar194._24_4_ = 0x3f800000;
    auVar194._28_4_ = 0x3f800000;
    auVar250 = vmovshdup_avx(local_5d0);
    auVar250 = vsubps_avx(auVar250,local_5d0);
    local_7a0._0_4_ = auVar250._0_4_;
    fVar216 = local_7a0._0_4_ * 0.04761905;
    local_a80._0_16_ = ZEXT416((uint)fVar216);
    uVar108 = local_5d0._0_4_;
    local_780._4_4_ = uVar108;
    local_780._0_4_ = uVar108;
    local_780._8_4_ = uVar108;
    local_780._12_4_ = uVar108;
    local_780._16_4_ = uVar108;
    local_780._20_4_ = uVar108;
    local_780._24_4_ = uVar108;
    local_780._28_4_ = uVar108;
    local_7a0._4_4_ = local_7a0._0_4_;
    local_7a0._8_4_ = local_7a0._0_4_;
    local_7a0._12_4_ = local_7a0._0_4_;
    local_7a0._16_4_ = local_7a0._0_4_;
    local_7a0._20_4_ = local_7a0._0_4_;
    local_7a0._24_4_ = local_7a0._0_4_;
    local_7a0._28_4_ = local_7a0._0_4_;
    auVar250 = vfmadd231ps_fma(local_780,local_7a0,_DAT_01f7b040);
    auVar122 = vsubps_avx(auVar194,ZEXT1632(auVar250));
    fVar199 = auVar122._0_4_;
    fVar213 = auVar122._4_4_;
    fVar278 = auVar122._8_4_;
    fVar284 = auVar122._12_4_;
    fVar236 = auVar122._16_4_;
    fVar212 = auVar122._20_4_;
    fVar214 = auVar122._24_4_;
    fVar107 = fVar199 * fVar199 * fVar199;
    fVar139 = fVar213 * fVar213 * fVar213;
    fVar140 = fVar278 * fVar278 * fVar278;
    fVar141 = fVar284 * fVar284 * fVar284;
    fVar142 = fVar236 * fVar236 * fVar236;
    fVar143 = fVar212 * fVar212 * fVar212;
    fVar144 = fVar214 * fVar214 * fVar214;
    fVar211 = auVar250._0_4_;
    fVar215 = auVar250._4_4_;
    fVar283 = auVar250._8_4_;
    fVar285 = auVar250._12_4_;
    fVar159 = fVar211 * fVar211 * fVar211;
    fVar177 = fVar215 * fVar215 * fVar215;
    fVar178 = fVar283 * fVar283 * fVar283;
    fVar179 = fVar285 * fVar285 * fVar285;
    fVar249 = fVar199 * fVar211;
    fVar256 = fVar213 * fVar215;
    fVar257 = fVar278 * fVar283;
    fVar258 = fVar284 * fVar285;
    fVar259 = fVar236 * 0.0;
    fVar260 = fVar212 * 0.0;
    fVar261 = fVar214 * 0.0;
    fVar267 = auVar266._28_4_ + auVar274._28_4_ + local_7a0._0_4_;
    fVar217 = auVar270._28_4_;
    auVar17._4_4_ = fVar139 * 0.16666667;
    auVar17._0_4_ = fVar107 * 0.16666667;
    auVar17._8_4_ = fVar140 * 0.16666667;
    auVar17._12_4_ = fVar141 * 0.16666667;
    auVar17._16_4_ = fVar142 * 0.16666667;
    auVar17._20_4_ = fVar143 * 0.16666667;
    auVar17._24_4_ = fVar144 * 0.16666667;
    auVar17._28_4_ = fVar267;
    auVar18._4_4_ =
         (fVar213 * fVar256 * 12.0 + fVar256 * fVar215 * 6.0 + fVar177 + fVar139 * 4.0) * 0.16666667
    ;
    auVar18._0_4_ =
         (fVar199 * fVar249 * 12.0 + fVar249 * fVar211 * 6.0 + fVar159 + fVar107 * 4.0) * 0.16666667
    ;
    auVar18._8_4_ =
         (fVar278 * fVar257 * 12.0 + fVar257 * fVar283 * 6.0 + fVar178 + fVar140 * 4.0) * 0.16666667
    ;
    auVar18._12_4_ =
         (fVar284 * fVar258 * 12.0 + fVar258 * fVar285 * 6.0 + fVar179 + fVar141 * 4.0) * 0.16666667
    ;
    auVar18._16_4_ =
         (fVar236 * fVar259 * 12.0 + fVar259 * 0.0 * 6.0 + fVar142 * 4.0 + 0.0) * 0.16666667;
    auVar18._20_4_ =
         (fVar212 * fVar260 * 12.0 + fVar260 * 0.0 * 6.0 + fVar143 * 4.0 + 0.0) * 0.16666667;
    auVar18._24_4_ =
         (fVar214 * fVar261 * 12.0 + fVar261 * 0.0 * 6.0 + fVar144 * 4.0 + 0.0) * 0.16666667;
    auVar18._28_4_ = fVar217;
    auVar19._4_4_ =
         (fVar177 * 4.0 + fVar139 + fVar256 * fVar215 * 12.0 + fVar213 * fVar256 * 6.0) * 0.16666667
    ;
    auVar19._0_4_ =
         (fVar159 * 4.0 + fVar107 + fVar249 * fVar211 * 12.0 + fVar199 * fVar249 * 6.0) * 0.16666667
    ;
    auVar19._8_4_ =
         (fVar178 * 4.0 + fVar140 + fVar257 * fVar283 * 12.0 + fVar278 * fVar257 * 6.0) * 0.16666667
    ;
    auVar19._12_4_ =
         (fVar179 * 4.0 + fVar141 + fVar258 * fVar285 * 12.0 + fVar284 * fVar258 * 6.0) * 0.16666667
    ;
    auVar19._16_4_ = (fVar142 + 0.0 + fVar259 * 0.0 * 12.0 + fVar236 * fVar259 * 6.0) * 0.16666667;
    auVar19._20_4_ = (fVar143 + 0.0 + fVar260 * 0.0 * 12.0 + fVar212 * fVar260 * 6.0) * 0.16666667;
    auVar19._24_4_ = (fVar144 + 0.0 + fVar261 * 0.0 * 12.0 + fVar214 * fVar261 * 6.0) * 0.16666667;
    auVar19._28_4_ = auVar274._28_4_;
    fVar159 = fVar159 * 0.16666667;
    fVar177 = fVar177 * 0.16666667;
    fVar178 = fVar178 * 0.16666667;
    fVar179 = fVar179 * 0.16666667;
    auVar20._4_4_ = fVar177 * fStack_51c;
    auVar20._0_4_ = fVar159 * local_520;
    auVar20._8_4_ = fVar178 * fStack_518;
    auVar20._12_4_ = fVar179 * fStack_514;
    auVar20._16_4_ = fStack_510 * 0.0;
    auVar20._20_4_ = fStack_50c * 0.0;
    auVar20._24_4_ = fStack_508 * 0.0;
    auVar20._28_4_ = local_7a0._0_4_;
    auVar21._4_4_ = fVar177 * local_4a0._4_4_;
    auVar21._0_4_ = fVar159 * (float)local_4a0;
    auVar21._8_4_ = fVar178 * (float)uStack_498;
    auVar21._12_4_ = fVar179 * uStack_498._4_4_;
    auVar21._16_4_ = (float)uStack_490 * 0.0;
    auVar21._20_4_ = uStack_490._4_4_ * 0.0;
    auVar21._24_4_ = (float)uStack_488 * 0.0;
    auVar21._28_4_ = 0;
    auVar22._4_4_ = fVar177 * local_4c0._4_4_;
    auVar22._0_4_ = fVar159 * (float)local_4c0;
    auVar22._8_4_ = fVar178 * (float)uStack_4b8;
    auVar22._12_4_ = fVar179 * uStack_4b8._4_4_;
    auVar22._16_4_ = (float)uStack_4b0 * 0.0;
    auVar22._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar22._24_4_ = (float)uStack_4a8 * 0.0;
    auVar22._28_4_ = 0x40800000;
    auVar23._4_4_ = fVar177 * local_4e0._4_4_;
    auVar23._0_4_ = fVar159 * (float)local_4e0;
    auVar23._8_4_ = fVar178 * (float)uStack_4d8;
    auVar23._12_4_ = fVar179 * uStack_4d8._4_4_;
    auVar23._16_4_ = (float)uStack_4d0 * 0.0;
    auVar23._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar23._24_4_ = (float)uStack_4c8 * 0.0;
    auVar23._28_4_ = fVar267 + fVar217 + auVar231._28_4_;
    auVar78._4_4_ = uStack_4fc;
    auVar78._0_4_ = local_500;
    auVar78._8_4_ = uStack_4f8;
    auVar78._12_4_ = uStack_4f4;
    auVar78._16_4_ = uStack_4f0;
    auVar78._20_4_ = uStack_4ec;
    auVar78._24_4_ = uStack_4e8;
    auVar78._28_4_ = uStack_4e4;
    auVar250 = vfmadd231ps_fma(auVar20,auVar19,auVar78);
    auVar84._8_8_ = uStack_438;
    auVar84._0_8_ = local_440;
    auVar84._16_8_ = uStack_430;
    auVar84._24_8_ = uStack_428;
    auVar4 = vfmadd231ps_fma(auVar21,auVar19,auVar84);
    auVar82._8_8_ = uStack_458;
    auVar82._0_8_ = local_460;
    auVar82._16_8_ = uStack_450;
    auVar82._24_8_ = uStack_448;
    auVar114 = vfmadd231ps_fma(auVar22,auVar19,auVar82);
    auVar80._8_8_ = uStack_478;
    auVar80._0_8_ = local_480;
    auVar80._16_8_ = uStack_470;
    auVar80._24_8_ = uStack_468;
    auVar275 = vfmadd231ps_fma(auVar23,auVar19,auVar80);
    auVar92._4_4_ = uStack_27c;
    auVar92._0_4_ = local_280;
    auVar92._8_4_ = uStack_278;
    auVar92._12_4_ = uStack_274;
    auVar92._16_4_ = uStack_270;
    auVar92._20_4_ = uStack_26c;
    auVar92._24_4_ = uStack_268;
    auVar92._28_4_ = uStack_264;
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar18,auVar92);
    auVar95._8_8_ = uStack_1f8;
    auVar95._0_8_ = local_200;
    auVar95._16_8_ = uStack_1f0;
    auVar95._24_8_ = uStack_1e8;
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar18,auVar95);
    auVar86._8_8_ = uStack_418;
    auVar86._0_8_ = local_420;
    auVar86._16_8_ = uStack_410;
    auVar86._24_8_ = uStack_408;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar18,auVar86);
    auVar94._8_8_ = uStack_218;
    auVar94._0_8_ = local_220;
    auVar94._16_8_ = uStack_210;
    auVar94._24_8_ = uStack_208;
    auVar275 = vfmadd231ps_fma(ZEXT1632(auVar275),auVar94,auVar18);
    auVar93._4_4_ = uStack_25c;
    auVar93._0_4_ = local_260;
    auVar93._8_4_ = uStack_258;
    auVar93._12_4_ = uStack_254;
    auVar93._16_4_ = uStack_250;
    auVar93._20_4_ = uStack_24c;
    auVar93._24_4_ = uStack_248;
    auVar93._28_4_ = uStack_244;
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar17,auVar93);
    auVar124 = ZEXT1632(auVar250);
    auVar88._8_8_ = uStack_3f8;
    auVar88._0_8_ = local_400;
    auVar88._16_8_ = uStack_3f0;
    auVar88._24_8_ = uStack_3e8;
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar17,auVar88);
    auVar96._8_8_ = uStack_1d8;
    auVar96._0_8_ = local_1e0;
    auVar96._16_8_ = uStack_1d0;
    auVar96._24_8_ = uStack_1c8;
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar17,auVar96);
    auVar239 = ZEXT1632(auVar250);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar275),auVar288,auVar17);
    local_900 = -0.0;
    uStack_8fc = 0x80000000;
    uStack_8f8 = 0x80000000;
    uStack_8f4 = 0x80000000;
    uStack_8f0 = 0x80000000;
    uStack_8ec = 0x80000000;
    uStack_8e8 = 0x80000000;
    uStack_8e4 = 0x80000000;
    auVar232._0_4_ = -fVar211 * fVar211;
    auVar232._4_4_ = -fVar215 * fVar215;
    auVar232._8_4_ = -fVar283 * fVar283;
    auVar232._12_4_ = -fVar285 * fVar285;
    auVar232._16_4_ = 0x80000000;
    auVar232._20_4_ = 0x80000000;
    auVar232._24_4_ = 0x80000000;
    auVar232._28_4_ = 0;
    auVar24._4_4_ = fVar256 * 4.0;
    auVar24._0_4_ = fVar249 * 4.0;
    auVar24._8_4_ = fVar257 * 4.0;
    auVar24._12_4_ = fVar258 * 4.0;
    auVar24._16_4_ = fVar259 * 4.0;
    auVar24._20_4_ = fVar260 * 4.0;
    fVar107 = auVar255._28_4_;
    auVar24._24_4_ = fVar261 * 4.0;
    auVar24._28_4_ = fVar107;
    auVar126 = vsubps_avx(auVar232,auVar24);
    auVar25._4_4_ = fVar213 * -fVar213 * 0.5;
    auVar25._0_4_ = fVar199 * -fVar199 * 0.5;
    auVar25._8_4_ = fVar278 * -fVar278 * 0.5;
    auVar25._12_4_ = fVar284 * -fVar284 * 0.5;
    auVar25._16_4_ = fVar236 * -fVar236 * 0.5;
    auVar25._20_4_ = fVar212 * -fVar212 * 0.5;
    auVar25._24_4_ = fVar214 * -fVar214 * 0.5;
    auVar25._28_4_ = auVar122._28_4_;
    auVar26._4_4_ = auVar126._4_4_ * 0.5;
    auVar26._0_4_ = auVar126._0_4_ * 0.5;
    auVar26._8_4_ = auVar126._8_4_ * 0.5;
    auVar26._12_4_ = auVar126._12_4_ * 0.5;
    auVar26._16_4_ = auVar126._16_4_ * 0.5;
    auVar26._20_4_ = auVar126._20_4_ * 0.5;
    fVar139 = auVar126._28_4_;
    auVar26._24_4_ = auVar126._24_4_ * 0.5;
    auVar26._28_4_ = fVar139;
    auVar27._4_4_ = (fVar256 * 4.0 + fVar213 * fVar213) * 0.5;
    auVar27._0_4_ = (fVar249 * 4.0 + fVar199 * fVar199) * 0.5;
    auVar27._8_4_ = (fVar257 * 4.0 + fVar278 * fVar278) * 0.5;
    auVar27._12_4_ = (fVar258 * 4.0 + fVar284 * fVar284) * 0.5;
    auVar27._16_4_ = (fVar259 * 4.0 + fVar236 * fVar236) * 0.5;
    auVar27._20_4_ = (fVar260 * 4.0 + fVar212 * fVar212) * 0.5;
    auVar27._24_4_ = (fVar261 * 4.0 + fVar214 * fVar214) * 0.5;
    auVar27._28_4_ = fVar107 + auVar243._28_4_;
    fVar199 = fVar211 * fVar211 * 0.5;
    fVar211 = fVar215 * fVar215 * 0.5;
    fVar213 = fVar283 * fVar283 * 0.5;
    fVar215 = fVar285 * fVar285 * 0.5;
    auVar28._4_4_ = fVar211 * fStack_51c;
    auVar28._0_4_ = fVar199 * local_520;
    auVar28._8_4_ = fVar213 * fStack_518;
    auVar28._12_4_ = fVar215 * fStack_514;
    auVar28._16_4_ = fStack_510 * 0.0;
    auVar28._20_4_ = fStack_50c * 0.0;
    auVar28._24_4_ = fStack_508 * 0.0;
    auVar28._28_4_ = fVar107;
    auVar29._4_4_ = fVar211 * local_4a0._4_4_;
    auVar29._0_4_ = fVar199 * (float)local_4a0;
    auVar29._8_4_ = fVar213 * (float)uStack_498;
    auVar29._12_4_ = fVar215 * uStack_498._4_4_;
    auVar29._16_4_ = (float)uStack_490 * 0.0;
    auVar29._20_4_ = uStack_490._4_4_ * 0.0;
    auVar29._24_4_ = (float)uStack_488 * 0.0;
    auVar29._28_4_ = 0x80000000;
    auVar30._4_4_ = fVar211 * local_4c0._4_4_;
    auVar30._0_4_ = fVar199 * (float)local_4c0;
    auVar30._8_4_ = fVar213 * (float)uStack_4b8;
    auVar30._12_4_ = fVar215 * uStack_4b8._4_4_;
    auVar30._16_4_ = (float)uStack_4b0 * 0.0;
    auVar30._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar30._24_4_ = (float)uStack_4a8 * 0.0;
    auVar30._28_4_ = fVar217;
    auVar31._4_4_ = fVar211 * local_4e0._4_4_;
    auVar31._0_4_ = fVar199 * (float)local_4e0;
    auVar31._8_4_ = fVar213 * (float)uStack_4d8;
    auVar31._12_4_ = fVar215 * uStack_4d8._4_4_;
    auVar31._16_4_ = (float)uStack_4d0 * 0.0;
    auVar31._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar31._24_4_ = (float)uStack_4c8 * 0.0;
    auVar31._28_4_ = 0;
    auVar79._4_4_ = uStack_4fc;
    auVar79._0_4_ = local_500;
    auVar79._8_4_ = uStack_4f8;
    auVar79._12_4_ = uStack_4f4;
    auVar79._16_4_ = uStack_4f0;
    auVar79._20_4_ = uStack_4ec;
    auVar79._24_4_ = uStack_4e8;
    auVar79._28_4_ = uStack_4e4;
    auVar250 = vfmadd231ps_fma(auVar28,auVar27,auVar79);
    auVar85._8_8_ = uStack_438;
    auVar85._0_8_ = local_440;
    auVar85._16_8_ = uStack_430;
    auVar85._24_8_ = uStack_428;
    auVar275 = vfmadd231ps_fma(auVar29,auVar27,auVar85);
    auVar83._8_8_ = uStack_458;
    auVar83._0_8_ = local_460;
    auVar83._16_8_ = uStack_450;
    auVar83._24_8_ = uStack_448;
    auVar5 = vfmadd231ps_fma(auVar30,auVar27,auVar83);
    auVar81._8_8_ = uStack_478;
    auVar81._0_8_ = local_480;
    auVar81._16_8_ = uStack_470;
    auVar81._24_8_ = uStack_468;
    auVar6 = vfmadd231ps_fma(auVar31,auVar27,auVar81);
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar26,auVar92);
    auVar275 = vfmadd231ps_fma(ZEXT1632(auVar275),auVar26,auVar95);
    auVar87._8_8_ = uStack_418;
    auVar87._0_8_ = local_420;
    auVar87._16_8_ = uStack_410;
    auVar87._24_8_ = uStack_408;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar26,auVar87);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar94,auVar26);
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar25,auVar93);
    auVar89._8_8_ = uStack_3f8;
    auVar89._0_8_ = local_400;
    auVar89._16_8_ = uStack_3f0;
    auVar89._24_8_ = uStack_3e8;
    auVar275 = vfmadd231ps_fma(ZEXT1632(auVar275),auVar25,auVar89);
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar25,auVar96);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar288,auVar25);
    fVar278 = auVar250._0_4_ * fVar216;
    fVar283 = auVar250._4_4_ * fVar216;
    local_980._4_4_ = fVar283;
    local_980._0_4_ = fVar278;
    fVar284 = auVar250._8_4_ * fVar216;
    local_980._8_4_ = fVar284;
    fVar285 = auVar250._12_4_ * fVar216;
    local_980._12_4_ = fVar285;
    local_980._16_4_ = fVar216 * 0.0;
    local_980._20_4_ = fVar216 * 0.0;
    local_980._24_4_ = fVar216 * 0.0;
    local_980._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    local_820._0_4_ = auVar275._0_4_ * fVar216;
    local_820._4_4_ = auVar275._4_4_ * fVar216;
    local_820._8_4_ = auVar275._8_4_ * fVar216;
    local_820._12_4_ = auVar275._12_4_ * fVar216;
    local_820._16_4_ = fVar216 * 0.0;
    local_820._20_4_ = fVar216 * 0.0;
    local_820._24_4_ = fVar216 * 0.0;
    local_820._28_4_ = 0;
    fVar261 = auVar5._0_4_ * fVar216;
    fVar267 = auVar5._4_4_ * fVar216;
    local_920._4_4_ = fVar267;
    local_920._0_4_ = fVar261;
    fVar290 = auVar5._8_4_ * fVar216;
    local_920._8_4_ = fVar290;
    fVar291 = auVar5._12_4_ * fVar216;
    local_920._12_4_ = fVar291;
    fVar292 = fVar216 * 0.0;
    local_920._16_4_ = fVar292;
    fVar293 = fVar216 * 0.0;
    local_920._20_4_ = fVar293;
    fVar294 = fVar216 * 0.0;
    local_920._24_4_ = fVar294;
    local_920._28_4_ = auVar3._4_4_;
    fVar199 = fVar216 * auVar6._0_4_;
    fVar211 = fVar216 * auVar6._4_4_;
    auVar32._4_4_ = fVar211;
    auVar32._0_4_ = fVar199;
    fVar213 = fVar216 * auVar6._8_4_;
    auVar32._8_4_ = fVar213;
    fVar215 = fVar216 * auVar6._12_4_;
    auVar32._12_4_ = fVar215;
    auVar32._16_4_ = fVar216 * 0.0;
    auVar32._20_4_ = fVar216 * 0.0;
    auVar32._24_4_ = fVar216 * 0.0;
    auVar32._28_4_ = fVar139;
    local_9e0 = vpermps_avx2(_DAT_01fb7720,auVar124);
    local_760 = vpermps_avx2(_DAT_01fb7720,auVar239);
    local_2c0 = vsubps_avx(local_9e0,auVar124);
    local_2a0 = vsubps_avx(local_760,auVar239);
    fVar236 = local_2a0._0_4_;
    fVar212 = local_2a0._4_4_;
    auVar33._4_4_ = fVar212 * fVar283;
    auVar33._0_4_ = fVar236 * fVar278;
    fVar214 = local_2a0._8_4_;
    auVar33._8_4_ = fVar214 * fVar284;
    fVar217 = local_2a0._12_4_;
    auVar33._12_4_ = fVar217 * fVar285;
    fVar107 = local_2a0._16_4_;
    auVar33._16_4_ = fVar107 * fVar216 * 0.0;
    fVar177 = local_2a0._20_4_;
    auVar33._20_4_ = fVar177 * fVar216 * 0.0;
    fVar178 = local_2a0._24_4_;
    auVar33._24_4_ = fVar178 * fVar216 * 0.0;
    auVar33._28_4_ = local_9e0._28_4_;
    auVar250 = vfmsub231ps_fma(auVar33,local_920,local_2c0);
    local_a00 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar4));
    local_2e0 = vsubps_avx(local_a00,ZEXT1632(auVar4));
    fVar179 = local_2c0._0_4_;
    fVar249 = local_2c0._4_4_;
    auVar34._4_4_ = fVar249 * local_820._4_4_;
    auVar34._0_4_ = fVar179 * (float)local_820._0_4_;
    fVar256 = local_2c0._8_4_;
    auVar34._8_4_ = fVar256 * local_820._8_4_;
    fVar257 = local_2c0._12_4_;
    auVar34._12_4_ = fVar257 * local_820._12_4_;
    fVar258 = local_2c0._16_4_;
    auVar34._16_4_ = fVar258 * local_820._16_4_;
    fVar259 = local_2c0._20_4_;
    auVar34._20_4_ = fVar259 * local_820._20_4_;
    fVar260 = local_2c0._24_4_;
    auVar34._24_4_ = fVar260 * local_820._24_4_;
    auVar34._28_4_ = local_a00._28_4_;
    auVar275 = vfmsub231ps_fma(auVar34,local_980,local_2e0);
    auVar35._28_4_ = auVar122._28_4_;
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(auVar275._12_4_ * auVar275._12_4_,
                            CONCAT48(auVar275._8_4_ * auVar275._8_4_,
                                     CONCAT44(auVar275._4_4_ * auVar275._4_4_,
                                              auVar275._0_4_ * auVar275._0_4_))));
    auVar250 = vfmadd231ps_fma(auVar35,ZEXT1632(auVar250),ZEXT1632(auVar250));
    auVar36._4_4_ = fVar212 * fVar212;
    auVar36._0_4_ = fVar236 * fVar236;
    auVar36._8_4_ = fVar214 * fVar214;
    auVar36._12_4_ = fVar217 * fVar217;
    auVar36._16_4_ = fVar107 * fVar107;
    auVar36._20_4_ = fVar177 * fVar177;
    auVar36._24_4_ = fVar178 * fVar178;
    auVar36._28_4_ = 0;
    auVar275 = vfmadd231ps_fma(auVar36,local_2e0,local_2e0);
    auVar275 = vfmadd231ps_fma(ZEXT1632(auVar275),local_2c0,local_2c0);
    fVar285 = local_2e0._0_4_;
    auVar195._0_4_ = fVar285 * fVar261;
    fVar140 = local_2e0._4_4_;
    auVar195._4_4_ = fVar140 * fVar267;
    fVar141 = local_2e0._8_4_;
    auVar195._8_4_ = fVar141 * fVar290;
    fVar142 = local_2e0._12_4_;
    auVar195._12_4_ = fVar142 * fVar291;
    fVar143 = local_2e0._16_4_;
    auVar195._16_4_ = fVar143 * fVar292;
    fVar144 = local_2e0._20_4_;
    auVar195._20_4_ = fVar144 * fVar293;
    fVar159 = local_2e0._24_4_;
    auVar195._24_4_ = fVar159 * fVar294;
    auVar195._28_4_ = 0;
    auVar122 = vrcpps_avx(ZEXT1632(auVar275));
    auVar5 = vfmsub231ps_fma(auVar195,local_820,local_2a0);
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar250),ZEXT1632(auVar5),ZEXT1632(auVar5));
    auVar149._8_4_ = 0x3f800000;
    auVar149._0_8_ = 0x3f8000003f800000;
    auVar149._12_4_ = 0x3f800000;
    auVar149._16_4_ = 0x3f800000;
    auVar149._20_4_ = 0x3f800000;
    auVar149._24_4_ = 0x3f800000;
    auVar149._28_4_ = 0x3f800000;
    auVar250 = vfnmadd213ps_fma(auVar122,ZEXT1632(auVar275),auVar149);
    auVar250 = vfmadd132ps_fma(ZEXT1632(auVar250),auVar122,auVar122);
    local_a60 = vpermps_avx2(_DAT_01fb7720,local_980);
    local_940 = vpermps_avx2(_DAT_01fb7720,local_920);
    auVar37._4_4_ = fVar212 * local_a60._4_4_;
    auVar37._0_4_ = fVar236 * local_a60._0_4_;
    auVar37._8_4_ = fVar214 * local_a60._8_4_;
    auVar37._12_4_ = fVar217 * local_a60._12_4_;
    auVar37._16_4_ = fVar107 * local_a60._16_4_;
    auVar37._20_4_ = fVar177 * local_a60._20_4_;
    auVar37._24_4_ = fVar178 * local_a60._24_4_;
    auVar37._28_4_ = auVar122._28_4_;
    auVar6 = vfmsub231ps_fma(auVar37,local_940,local_2c0);
    local_960 = vpermps_avx2(_DAT_01fb7720,local_820);
    auVar38._4_4_ = fVar249 * local_960._4_4_;
    auVar38._0_4_ = fVar179 * local_960._0_4_;
    auVar38._8_4_ = fVar256 * local_960._8_4_;
    auVar38._12_4_ = fVar257 * local_960._12_4_;
    auVar38._16_4_ = fVar258 * local_960._16_4_;
    auVar38._20_4_ = fVar259 * local_960._20_4_;
    auVar38._24_4_ = fVar260 * local_960._24_4_;
    auVar38._28_4_ = 0;
    auVar12 = local_a60;
    auVar7 = vfmsub231ps_fma(auVar38,local_a60,local_2e0);
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * auVar7._12_4_,
                                                CONCAT48(auVar7._8_4_ * auVar7._8_4_,
                                                         CONCAT44(auVar7._4_4_ * auVar7._4_4_,
                                                                  auVar7._0_4_ * auVar7._0_4_)))),
                             ZEXT1632(auVar6),ZEXT1632(auVar6));
    auVar16 = local_940;
    auVar208._0_4_ = fVar285 * local_940._0_4_;
    auVar208._4_4_ = fVar140 * local_940._4_4_;
    auVar208._8_4_ = fVar141 * local_940._8_4_;
    auVar208._12_4_ = fVar142 * local_940._12_4_;
    auVar208._16_4_ = fVar143 * local_940._16_4_;
    auVar208._20_4_ = fVar144 * local_940._20_4_;
    auVar208._24_4_ = fVar159 * local_940._24_4_;
    auVar208._28_4_ = 0;
    auVar13 = local_960;
    auVar7 = vfmsub231ps_fma(auVar208,local_960,local_2a0);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar7),ZEXT1632(auVar7));
    auVar122 = vmaxps_avx(ZEXT1632(CONCAT412(auVar5._12_4_ * auVar250._12_4_,
                                             CONCAT48(auVar5._8_4_ * auVar250._8_4_,
                                                      CONCAT44(auVar5._4_4_ * auVar250._4_4_,
                                                               auVar5._0_4_ * auVar250._0_4_)))),
                          ZEXT1632(CONCAT412(auVar6._12_4_ * auVar250._12_4_,
                                             CONCAT48(auVar6._8_4_ * auVar250._8_4_,
                                                      CONCAT44(auVar6._4_4_ * auVar250._4_4_,
                                                               auVar6._0_4_ * auVar250._0_4_)))));
    local_7c0._0_4_ = fVar199 + auVar114._0_4_;
    local_7c0._4_4_ = fVar211 + auVar114._4_4_;
    fStack_7b8 = fVar213 + auVar114._8_4_;
    fStack_7b4 = fVar215 + auVar114._12_4_;
    fStack_7b0 = fVar216 * 0.0 + 0.0;
    fStack_7ac = fVar216 * 0.0 + 0.0;
    fStack_7a8 = fVar216 * 0.0 + 0.0;
    fStack_7a4 = fVar139 + 0.0;
    auVar126 = vsubps_avx(ZEXT1632(auVar114),auVar32);
    local_7e0 = vpermps_avx2(_DAT_01fb7720,auVar126);
    local_6c0 = ZEXT1632(auVar114);
    _local_800 = vpermps_avx2(_DAT_01fb7720,local_6c0);
    auVar126 = vmaxps_avx(local_6c0,_local_7c0);
    auVar11 = vrsqrtps_avx(ZEXT1632(auVar275));
    auVar273 = vmaxps_avx(local_7e0,_local_800);
    auVar273 = vmaxps_avx(auVar126,auVar273);
    uVar108 = auVar126._28_4_;
    fVar199 = auVar11._0_4_;
    fVar211 = auVar11._4_4_;
    fVar213 = auVar11._8_4_;
    fVar215 = auVar11._12_4_;
    fVar278 = auVar11._16_4_;
    fVar283 = auVar11._20_4_;
    fVar284 = auVar11._24_4_;
    auVar39._4_4_ = fVar211 * fVar211 * fVar211 * auVar275._4_4_ * -0.5;
    auVar39._0_4_ = fVar199 * fVar199 * fVar199 * auVar275._0_4_ * -0.5;
    auVar39._8_4_ = fVar213 * fVar213 * fVar213 * auVar275._8_4_ * -0.5;
    auVar39._12_4_ = fVar215 * fVar215 * fVar215 * auVar275._12_4_ * -0.5;
    auVar39._16_4_ = fVar278 * fVar278 * fVar278 * -0.0;
    auVar39._20_4_ = fVar283 * fVar283 * fVar283 * -0.0;
    auVar39._24_4_ = fVar284 * fVar284 * fVar284 * -0.0;
    auVar39._28_4_ = uStack_264;
    auVar125._8_4_ = 0x3fc00000;
    auVar125._0_8_ = 0x3fc000003fc00000;
    auVar125._12_4_ = 0x3fc00000;
    auVar125._16_4_ = 0x3fc00000;
    auVar125._20_4_ = 0x3fc00000;
    auVar125._24_4_ = 0x3fc00000;
    auVar125._28_4_ = 0x3fc00000;
    auVar250 = vfmadd231ps_fma(auVar39,auVar125,auVar11);
    fVar211 = auVar250._0_4_;
    fVar215 = auVar250._4_4_;
    auVar40._4_4_ = fVar140 * fVar215;
    auVar40._0_4_ = fVar285 * fVar211;
    fVar283 = auVar250._8_4_;
    auVar40._8_4_ = fVar141 * fVar283;
    fVar285 = auVar250._12_4_;
    auVar40._12_4_ = fVar142 * fVar285;
    auVar40._16_4_ = fVar143 * 0.0;
    auVar40._20_4_ = fVar144 * 0.0;
    auVar40._24_4_ = fVar159 * 0.0;
    auVar40._28_4_ = uVar108;
    auVar226._0_4_ = local_640 * fVar236 * fVar211;
    auVar226._4_4_ = fStack_63c * fVar212 * fVar215;
    auVar226._8_4_ = fStack_638 * fVar214 * fVar283;
    auVar226._12_4_ = fStack_634 * fVar217 * fVar285;
    auVar226._16_4_ = fStack_630 * fVar107 * 0.0;
    auVar226._20_4_ = fStack_62c * fVar177 * 0.0;
    auVar226._24_4_ = fStack_628 * fVar178 * 0.0;
    auVar226._28_4_ = 0;
    auVar114 = vfmadd231ps_fma(auVar226,auVar40,_local_620);
    auVar126 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar11 = vsubps_avx(auVar126,auVar239);
    fVar140 = auVar11._0_4_;
    fVar141 = auVar11._4_4_;
    auVar41._4_4_ = fVar141 * fVar212 * fVar215;
    auVar41._0_4_ = fVar140 * fVar236 * fVar211;
    fVar142 = auVar11._8_4_;
    auVar41._8_4_ = fVar142 * fVar214 * fVar283;
    fVar143 = auVar11._12_4_;
    auVar41._12_4_ = fVar143 * fVar217 * fVar285;
    fVar144 = auVar11._16_4_;
    auVar41._16_4_ = fVar144 * fVar107 * 0.0;
    fVar159 = auVar11._20_4_;
    auVar41._20_4_ = fVar159 * fVar177 * 0.0;
    fVar177 = auVar11._24_4_;
    auVar41._24_4_ = fVar177 * fVar178 * 0.0;
    auVar41._28_4_ = local_2e0._28_4_;
    local_300 = ZEXT1632(auVar4);
    auVar126 = vsubps_avx(auVar126,local_300);
    auVar4 = vfmadd231ps_fma(auVar41,auVar126,auVar40);
    auVar42._4_4_ = fVar249 * fVar215;
    auVar42._0_4_ = fVar179 * fVar211;
    auVar42._8_4_ = fVar256 * fVar283;
    auVar42._12_4_ = fVar257 * fVar285;
    auVar42._16_4_ = fVar258 * 0.0;
    auVar42._20_4_ = fVar259 * 0.0;
    auVar42._24_4_ = fVar260 * 0.0;
    auVar42._28_4_ = uVar108;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar42,local_600);
    auVar127 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar133 = vsubps_avx(auVar127,auVar124);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar133,auVar42);
    auVar270 = ZEXT1664(auVar4);
    auVar43._4_4_ = fStack_63c * fVar141;
    auVar43._0_4_ = local_640 * fVar140;
    auVar43._8_4_ = fStack_638 * fVar142;
    auVar43._12_4_ = fStack_634 * fVar143;
    auVar43._16_4_ = fStack_630 * fVar144;
    auVar43._20_4_ = fStack_62c * fVar159;
    auVar43._24_4_ = fStack_628 * fVar177;
    auVar43._28_4_ = uVar108;
    auVar275 = vfmadd231ps_fma(auVar43,_local_620,auVar126);
    auVar275 = vfmadd231ps_fma(ZEXT1632(auVar275),local_600,auVar133);
    fVar213 = auVar114._0_4_;
    fVar199 = auVar4._0_4_;
    fVar278 = auVar114._4_4_;
    fVar212 = auVar4._4_4_;
    fVar284 = auVar114._8_4_;
    fVar214 = auVar4._8_4_;
    fVar236 = auVar114._12_4_;
    fVar216 = auVar4._12_4_;
    auVar44._28_4_ = local_600._28_4_;
    auVar44._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * fVar236,
                            CONCAT48(fVar214 * fVar284,CONCAT44(fVar212 * fVar278,fVar199 * fVar213)
                                    )));
    auVar233 = vsubps_avx(ZEXT1632(auVar275),auVar44);
    auVar45._4_4_ = fVar141 * fVar141;
    auVar45._0_4_ = fVar140 * fVar140;
    auVar45._8_4_ = fVar142 * fVar142;
    auVar45._12_4_ = fVar143 * fVar143;
    auVar45._16_4_ = fVar144 * fVar144;
    auVar45._20_4_ = fVar159 * fVar159;
    auVar45._24_4_ = fVar177 * fVar177;
    auVar45._28_4_ = local_600._28_4_;
    auVar275 = vfmadd231ps_fma(auVar45,auVar126,auVar126);
    auVar275 = vfmadd231ps_fma(ZEXT1632(auVar275),auVar133,auVar133);
    auVar225 = ZEXT1632(auVar4);
    auVar46._28_4_ = local_620._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * fVar216,
                            CONCAT48(fVar214 * fVar214,CONCAT44(fVar212 * fVar212,fVar199 * fVar199)
                                    )));
    local_8e0 = vsubps_avx(ZEXT1632(auVar275),auVar46);
    local_680 = vsqrtps_avx(auVar122);
    fVar199 = (auVar273._0_4_ + local_680._0_4_) * 1.0000002;
    fVar212 = (auVar273._4_4_ + local_680._4_4_) * 1.0000002;
    fVar214 = (auVar273._8_4_ + local_680._8_4_) * 1.0000002;
    fVar216 = (auVar273._12_4_ + local_680._12_4_) * 1.0000002;
    fVar217 = (auVar273._16_4_ + local_680._16_4_) * 1.0000002;
    fVar107 = (auVar273._20_4_ + local_680._20_4_) * 1.0000002;
    fVar139 = (auVar273._24_4_ + local_680._24_4_) * 1.0000002;
    auVar47._4_4_ = fVar212 * fVar212;
    auVar47._0_4_ = fVar199 * fVar199;
    auVar47._8_4_ = fVar214 * fVar214;
    auVar47._12_4_ = fVar216 * fVar216;
    auVar47._16_4_ = fVar217 * fVar217;
    auVar47._20_4_ = fVar107 * fVar107;
    auVar47._24_4_ = fVar139 * fVar139;
    auVar47._28_4_ = auVar273._28_4_ + local_680._28_4_;
    local_880 = auVar233._0_4_ + auVar233._0_4_;
    fStack_87c = auVar233._4_4_ + auVar233._4_4_;
    fStack_878 = auVar233._8_4_ + auVar233._8_4_;
    fStack_874 = auVar233._12_4_ + auVar233._12_4_;
    fStack_870 = auVar233._16_4_ + auVar233._16_4_;
    fStack_86c = auVar233._20_4_ + auVar233._20_4_;
    fStack_868 = auVar233._24_4_ + auVar233._24_4_;
    fVar199 = auVar233._28_4_;
    fStack_864 = fVar199 + fVar199;
    auVar273 = vsubps_avx(local_8e0,auVar47);
    auVar266 = ZEXT3264(auVar273);
    auVar48._28_4_ = fVar199;
    auVar48._0_28_ =
         ZEXT1628(CONCAT412(fVar236 * fVar236,
                            CONCAT48(fVar284 * fVar284,CONCAT44(fVar278 * fVar278,fVar213 * fVar213)
                                    )));
    auVar233 = vsubps_avx(local_240,auVar48);
    auVar255 = ZEXT3264(auVar233);
    local_660._4_4_ = fStack_87c * fStack_87c;
    local_660._0_4_ = local_880 * local_880;
    local_660._8_4_ = fStack_878 * fStack_878;
    local_660._12_4_ = fStack_874 * fStack_874;
    local_660._16_4_ = fStack_870 * fStack_870;
    local_660._20_4_ = fStack_86c * fStack_86c;
    local_660._24_4_ = fStack_868 * fStack_868;
    local_660._28_4_ = local_8e0._28_4_;
    fVar199 = auVar233._0_4_;
    local_6a0._0_4_ = fVar199 * 4.0;
    fVar213 = auVar233._4_4_;
    local_6a0._4_4_ = fVar213 * 4.0;
    fVar278 = auVar233._8_4_;
    fStack_698 = fVar278 * 4.0;
    fVar284 = auVar233._12_4_;
    fStack_694 = fVar284 * 4.0;
    fVar236 = auVar233._16_4_;
    fStack_690 = fVar236 * 4.0;
    fVar212 = auVar233._20_4_;
    fStack_68c = fVar212 * 4.0;
    fVar214 = auVar233._24_4_;
    fStack_688 = fVar214 * 4.0;
    uStack_684 = 0x40800000;
    auVar49._4_4_ = auVar273._4_4_ * (float)local_6a0._4_4_;
    auVar49._0_4_ = auVar273._0_4_ * (float)local_6a0._0_4_;
    auVar49._8_4_ = auVar273._8_4_ * fStack_698;
    auVar49._12_4_ = auVar273._12_4_ * fStack_694;
    auVar49._16_4_ = auVar273._16_4_ * fStack_690;
    auVar49._20_4_ = auVar273._20_4_ * fStack_68c;
    auVar49._24_4_ = auVar273._24_4_ * fStack_688;
    auVar49._28_4_ = 0x40800000;
    auVar170 = vsubps_avx(local_660,auVar49);
    auVar122 = vcmpps_avx(auVar170,auVar127,5);
    auVar274 = ZEXT3264(local_720);
    local_3a0 = vandps_avx(local_720,auVar48);
    local_8c0._0_4_ = fVar199 + fVar199;
    local_8c0._4_4_ = fVar213 + fVar213;
    local_8c0._8_4_ = fVar278 + fVar278;
    local_8c0._12_4_ = fVar284 + fVar284;
    local_8c0._16_4_ = fVar236 + fVar236;
    local_8c0._20_4_ = fVar212 + fVar212;
    local_8c0._24_4_ = fVar214 + fVar214;
    local_8c0._28_4_ = auVar233._28_4_ + auVar233._28_4_;
    local_8a0 = vandps_avx(auVar233,local_720);
    local_320 = ZEXT1632(auVar114);
    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar122 >> 0x7f,0) == '\0') &&
          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar122 >> 0xbf,0) == '\0') &&
        (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar122[0x1f])
    {
      auVar150._8_4_ = 0x7f800000;
      auVar150._0_8_ = 0x7f8000007f800000;
      auVar150._12_4_ = 0x7f800000;
      auVar150._16_4_ = 0x7f800000;
      auVar150._20_4_ = 0x7f800000;
      auVar150._24_4_ = 0x7f800000;
      auVar150._28_4_ = 0x7f800000;
      auVar276._8_4_ = 0xff800000;
      auVar276._0_8_ = 0xff800000ff800000;
      auVar276._12_4_ = 0xff800000;
      auVar276._16_4_ = 0xff800000;
      auVar276._20_4_ = 0xff800000;
      auVar276._24_4_ = 0xff800000;
      auVar276._28_4_ = 0xff800000;
    }
    else {
      auVar76._8_4_ = fStack_878;
      auVar76._0_8_ = CONCAT44(fStack_87c,local_880);
      auVar76._12_4_ = fStack_874;
      auVar76._16_4_ = fStack_870;
      auVar76._20_4_ = fStack_86c;
      auVar76._24_4_ = fStack_868;
      auVar76._28_4_ = fStack_864;
      local_a80 = auVar122;
      auVar253 = vsqrtps_avx(auVar170);
      auVar245 = vrcpps_avx(local_8c0);
      auVar233 = vcmpps_avx(auVar170,auVar127,5);
      auVar128._8_4_ = 0x3f800000;
      auVar128._0_8_ = 0x3f8000003f800000;
      auVar128._12_4_ = 0x3f800000;
      auVar128._16_4_ = 0x3f800000;
      auVar128._20_4_ = 0x3f800000;
      auVar128._24_4_ = 0x3f800000;
      auVar128._28_4_ = 0x3f800000;
      auVar4 = vfnmadd213ps_fma(auVar245,local_8c0,auVar128);
      auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar245,auVar245);
      auVar271._0_8_ = CONCAT44(fStack_87c,local_880) ^ 0x8000000080000000;
      auVar271._8_4_ = -fStack_878;
      auVar271._12_4_ = -fStack_874;
      auVar271._16_4_ = -fStack_870;
      auVar271._20_4_ = -fStack_86c;
      auVar271._24_4_ = -fStack_868;
      auVar271._28_4_ = -fStack_864;
      auVar170 = vsubps_avx(auVar271,auVar253);
      auVar50._4_4_ = auVar170._4_4_ * auVar4._4_4_;
      auVar50._0_4_ = auVar170._0_4_ * auVar4._0_4_;
      auVar50._8_4_ = auVar170._8_4_ * auVar4._8_4_;
      auVar50._12_4_ = auVar170._12_4_ * auVar4._12_4_;
      auVar50._16_4_ = auVar170._16_4_ * 0.0;
      auVar50._20_4_ = auVar170._20_4_ * 0.0;
      auVar50._24_4_ = auVar170._24_4_ * 0.0;
      auVar50._28_4_ = auVar170._28_4_;
      auVar274 = ZEXT3264(auVar50);
      auVar170 = vsubps_avx(auVar253,auVar76);
      auVar51._4_4_ = auVar4._4_4_ * auVar170._4_4_;
      auVar51._0_4_ = auVar4._0_4_ * auVar170._0_4_;
      auVar51._8_4_ = auVar4._8_4_ * auVar170._8_4_;
      auVar51._12_4_ = auVar4._12_4_ * auVar170._12_4_;
      auVar51._16_4_ = auVar170._16_4_ * 0.0;
      auVar51._20_4_ = auVar170._20_4_ * 0.0;
      auVar51._24_4_ = auVar170._24_4_ * 0.0;
      auVar51._28_4_ = auVar170._28_4_;
      auVar4 = vfmadd213ps_fma(local_320,auVar50,auVar225);
      local_380 = fVar211 * auVar4._0_4_;
      fStack_37c = fVar215 * auVar4._4_4_;
      fStack_378 = fVar283 * auVar4._8_4_;
      fStack_374 = fVar285 * auVar4._12_4_;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = 0x3f800000;
      auVar4 = vfmadd213ps_fma(local_320,auVar51,auVar225);
      auVar255 = ZEXT1664(auVar4);
      local_360 = fVar211 * auVar4._0_4_;
      fStack_35c = fVar215 * auVar4._4_4_;
      fStack_358 = fVar283 * auVar4._8_4_;
      fStack_354 = fVar285 * auVar4._12_4_;
      uStack_350 = 0;
      uStack_34c = 0;
      uStack_348 = 0;
      uStack_344 = 0x3f800000;
      auVar129._8_4_ = 0x7f800000;
      auVar129._0_8_ = 0x7f8000007f800000;
      auVar129._12_4_ = 0x7f800000;
      auVar129._16_4_ = 0x7f800000;
      auVar129._20_4_ = 0x7f800000;
      auVar129._24_4_ = 0x7f800000;
      auVar129._28_4_ = 0x7f800000;
      auVar150 = vblendvps_avx(auVar129,auVar50,auVar233);
      auVar130._8_4_ = 0xff800000;
      auVar130._0_8_ = 0xff800000ff800000;
      auVar130._12_4_ = 0xff800000;
      auVar130._16_4_ = 0xff800000;
      auVar130._20_4_ = 0xff800000;
      auVar130._24_4_ = 0xff800000;
      auVar130._28_4_ = 0xff800000;
      auVar276 = vblendvps_avx(auVar130,auVar51,auVar233);
      auVar170 = vmaxps_avx(local_540,local_3a0);
      auVar52._4_4_ = auVar170._4_4_ * 1.9073486e-06;
      auVar52._0_4_ = auVar170._0_4_ * 1.9073486e-06;
      auVar52._8_4_ = auVar170._8_4_ * 1.9073486e-06;
      auVar52._12_4_ = auVar170._12_4_ * 1.9073486e-06;
      auVar52._16_4_ = auVar170._16_4_ * 1.9073486e-06;
      auVar52._20_4_ = auVar170._20_4_ * 1.9073486e-06;
      auVar52._24_4_ = auVar170._24_4_ * 1.9073486e-06;
      auVar52._28_4_ = auVar170._28_4_;
      auVar170 = vcmpps_avx(local_8a0,auVar52,1);
      auVar127 = auVar233 & auVar170;
      if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar127 >> 0x7f,0) != '\0') ||
            (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar127 >> 0xbf,0) != '\0') ||
          (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar127[0x1f] < '\0') {
        auVar122 = vandps_avx(auVar170,auVar233);
        auVar170 = vcmpps_avx(auVar273,_DAT_01f7b000,2);
        auVar265._8_4_ = 0xff800000;
        auVar265._0_8_ = 0xff800000ff800000;
        auVar265._12_4_ = 0xff800000;
        auVar265._16_4_ = 0xff800000;
        auVar265._20_4_ = 0xff800000;
        auVar265._24_4_ = 0xff800000;
        auVar265._28_4_ = 0xff800000;
        auVar266 = ZEXT3264(auVar265);
        auVar138._8_4_ = 0x7f800000;
        auVar138._0_8_ = 0x7f8000007f800000;
        auVar138._12_4_ = 0x7f800000;
        auVar138._16_4_ = 0x7f800000;
        auVar138._20_4_ = 0x7f800000;
        auVar138._24_4_ = 0x7f800000;
        auVar138._28_4_ = 0x7f800000;
        auVar273 = vblendvps_avx(auVar138,auVar265,auVar170);
        auVar4 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
        auVar127 = vpmovsxwd_avx2(auVar4);
        auVar255 = ZEXT3264(auVar127);
        auVar150 = vblendvps_avx(auVar150,auVar273,auVar127);
        auVar273 = vblendvps_avx(auVar265,auVar138,auVar170);
        auVar274 = ZEXT3264(auVar273);
        auVar276 = vblendvps_avx(auVar276,auVar273,auVar127);
        auVar198._0_8_ = auVar122._0_8_ ^ 0xffffffffffffffff;
        auVar198._8_4_ = auVar122._8_4_ ^ 0xffffffff;
        auVar198._12_4_ = auVar122._12_4_ ^ 0xffffffff;
        auVar198._16_4_ = auVar122._16_4_ ^ 0xffffffff;
        auVar198._20_4_ = auVar122._20_4_ ^ 0xffffffff;
        auVar198._24_4_ = auVar122._24_4_ ^ 0xffffffff;
        auVar198._28_4_ = auVar122._28_4_ ^ 0xffffffff;
        auVar122 = vorps_avx(auVar170,auVar198);
        auVar122 = vandps_avx(auVar233,auVar122);
      }
    }
    auVar273 = local_6e0 & auVar122;
    if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar273 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar273 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar273 >> 0x7f,0) == '\0') &&
          (auVar273 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar273 >> 0xbf,0) == '\0') &&
        (auVar273 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar273[0x1f])
    {
LAB_012e62d0:
      auVar243 = ZEXT3264(auVar126);
      auVar231 = ZEXT3264(local_840);
    }
    else {
      local_3c0 = ZEXT1632(auVar250);
      fVar199 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_860._0_4_;
      auVar196._4_4_ = fVar199;
      auVar196._0_4_ = fVar199;
      auVar196._8_4_ = fVar199;
      auVar196._12_4_ = fVar199;
      auVar196._16_4_ = fVar199;
      auVar196._20_4_ = fVar199;
      auVar196._24_4_ = fVar199;
      auVar196._28_4_ = fVar199;
      auVar233 = vmaxps_avx(auVar196,auVar150);
      fVar199 = (ray->super_RayK<1>).tfar - (float)local_860._0_4_;
      auVar209._4_4_ = fVar199;
      auVar209._0_4_ = fVar199;
      auVar209._8_4_ = fVar199;
      auVar209._12_4_ = fVar199;
      auVar209._16_4_ = fVar199;
      auVar209._20_4_ = fVar199;
      auVar209._24_4_ = fVar199;
      auVar209._28_4_ = fVar199;
      auVar170 = vminps_avx(auVar209,auVar276);
      auVar53._4_4_ = fVar267 * fVar141;
      auVar53._0_4_ = fVar261 * fVar140;
      auVar53._8_4_ = fVar290 * fVar142;
      auVar53._12_4_ = fVar291 * fVar143;
      auVar53._16_4_ = fVar292 * fVar144;
      auVar53._20_4_ = fVar293 * fVar159;
      auVar53._24_4_ = fVar294 * fVar177;
      auVar53._28_4_ = fVar199;
      auVar250 = vfmadd213ps_fma(auVar126,local_820,auVar53);
      auVar4 = vfmadd213ps_fma(auVar133,local_980,ZEXT1632(auVar250));
      auVar54._4_4_ = fVar267 * fStack_63c;
      auVar54._0_4_ = fVar261 * local_640;
      auVar54._8_4_ = fVar290 * fStack_638;
      auVar54._12_4_ = fVar291 * fStack_634;
      auVar54._16_4_ = fVar292 * fStack_630;
      auVar54._20_4_ = fVar293 * fStack_62c;
      auVar54._24_4_ = fVar294 * fStack_628;
      auVar54._28_4_ = auVar11._28_4_;
      auVar250 = vfmadd231ps_fma(auVar54,_local_620,local_820);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar250),local_600,local_980);
      auVar266 = ZEXT3264(local_720);
      auVar126 = vandps_avx(local_720,ZEXT1632(auVar114));
      auVar240._8_4_ = 0x219392ef;
      auVar240._0_8_ = 0x219392ef219392ef;
      auVar240._12_4_ = 0x219392ef;
      auVar240._16_4_ = 0x219392ef;
      auVar240._20_4_ = 0x219392ef;
      auVar240._24_4_ = 0x219392ef;
      auVar240._28_4_ = 0x219392ef;
      auVar273 = vcmpps_avx(auVar126,auVar240,1);
      auVar126 = vrcpps_avx(ZEXT1632(auVar114));
      local_a80 = auVar122;
      auVar277._8_4_ = 0x3f800000;
      auVar277._0_8_ = 0x3f8000003f800000;
      auVar277._12_4_ = 0x3f800000;
      auVar277._16_4_ = 0x3f800000;
      auVar277._20_4_ = 0x3f800000;
      auVar277._24_4_ = 0x3f800000;
      auVar277._28_4_ = 0x3f800000;
      auVar133 = ZEXT1632(auVar114);
      auVar250 = vfnmadd213ps_fma(auVar126,auVar133,auVar277);
      auVar250 = vfmadd132ps_fma(ZEXT1632(auVar250),auVar126,auVar126);
      auVar281._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
      auVar281._8_4_ = auVar114._8_4_ ^ 0x80000000;
      auVar281._12_4_ = auVar114._12_4_ ^ 0x80000000;
      auVar281._16_4_ = 0x80000000;
      auVar281._20_4_ = 0x80000000;
      auVar281._24_4_ = 0x80000000;
      auVar281._28_4_ = 0x80000000;
      auVar55._4_4_ = auVar250._4_4_ * -auVar4._4_4_;
      auVar55._0_4_ = auVar250._0_4_ * -auVar4._0_4_;
      auVar55._8_4_ = auVar250._8_4_ * -auVar4._8_4_;
      auVar55._12_4_ = auVar250._12_4_ * -auVar4._12_4_;
      auVar55._16_4_ = 0x80000000;
      auVar55._20_4_ = 0x80000000;
      auVar55._24_4_ = 0x80000000;
      auVar55._28_4_ = 0x80000000;
      auVar126 = vcmpps_avx(auVar133,auVar281,1);
      auVar126 = vorps_avx(auVar273,auVar126);
      auVar272._8_4_ = 0xff800000;
      auVar272._0_8_ = 0xff800000ff800000;
      auVar272._12_4_ = 0xff800000;
      auVar272._16_4_ = 0xff800000;
      auVar272._20_4_ = 0xff800000;
      auVar272._24_4_ = 0xff800000;
      auVar272._28_4_ = 0xff800000;
      auVar126 = vblendvps_avx(auVar55,auVar272,auVar126);
      auVar11 = vmaxps_avx(auVar233,auVar126);
      auVar126 = vcmpps_avx(auVar133,auVar281,6);
      auVar126 = vorps_avx(auVar273,auVar126);
      auVar282._8_4_ = 0x7f800000;
      auVar282._0_8_ = 0x7f8000007f800000;
      auVar282._12_4_ = 0x7f800000;
      auVar282._16_4_ = 0x7f800000;
      auVar282._20_4_ = 0x7f800000;
      auVar282._24_4_ = 0x7f800000;
      auVar282._28_4_ = 0x7f800000;
      auVar126 = vblendvps_avx(auVar55,auVar282,auVar126);
      auVar133 = vminps_avx(auVar170,auVar126);
      fVar199 = -local_940._0_4_;
      fVar213 = -local_940._4_4_;
      fVar278 = -local_940._8_4_;
      fVar284 = -local_940._12_4_;
      fVar236 = -local_940._16_4_;
      fVar212 = -local_940._20_4_;
      fVar214 = -local_940._24_4_;
      auVar241._0_8_ = local_960._0_8_ ^ 0x8000000080000000;
      auVar241._8_4_ = -local_960._8_4_;
      auVar241._12_4_ = -local_960._12_4_;
      auVar241._16_4_ = -local_960._16_4_;
      auVar241._20_4_ = -local_960._20_4_;
      auVar241._24_4_ = -local_960._24_4_;
      auVar241._28_4_ = local_960._28_4_ ^ 0x80000000;
      auVar273 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar126 = vsubps_avx(auVar273,local_a00);
      auVar273 = vsubps_avx(auVar273,local_760);
      auVar56._4_4_ = auVar273._4_4_ * fVar213;
      auVar56._0_4_ = auVar273._0_4_ * fVar199;
      auVar56._8_4_ = auVar273._8_4_ * fVar278;
      auVar56._12_4_ = auVar273._12_4_ * fVar284;
      auVar56._16_4_ = auVar273._16_4_ * fVar236;
      auVar56._20_4_ = auVar273._20_4_ * fVar212;
      auVar56._24_4_ = auVar273._24_4_ * fVar214;
      auVar56._28_4_ = auVar273._28_4_;
      auVar250 = vfmadd231ps_fma(auVar56,auVar241,auVar126);
      auVar246._0_8_ = local_a60._0_8_ ^ 0x8000000080000000;
      auVar246._8_4_ = -local_a60._8_4_;
      auVar246._12_4_ = -local_a60._12_4_;
      auVar246._16_4_ = -local_a60._16_4_;
      auVar246._20_4_ = -local_a60._20_4_;
      auVar246._24_4_ = -local_a60._24_4_;
      auVar246._28_4_ = local_a60._28_4_ ^ 0x80000000;
      auVar126 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,local_9e0);
      auVar4 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar246,auVar126);
      auVar57._4_4_ = fStack_63c * fVar213;
      auVar57._0_4_ = local_640 * fVar199;
      auVar57._8_4_ = fStack_638 * fVar278;
      auVar57._12_4_ = fStack_634 * fVar284;
      auVar57._16_4_ = fStack_630 * fVar236;
      auVar57._20_4_ = fStack_62c * fVar212;
      auVar57._24_4_ = fStack_628 * fVar214;
      auVar57._28_4_ = local_940._28_4_ ^ 0x80000000;
      auVar250 = vfmadd231ps_fma(auVar57,_local_620,auVar241);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar250),local_600,auVar246);
      auVar126 = vandps_avx(local_720,ZEXT1632(auVar114));
      auVar273 = vrcpps_avx(ZEXT1632(auVar114));
      auVar151._8_4_ = 0x219392ef;
      auVar151._0_8_ = 0x219392ef219392ef;
      auVar151._12_4_ = 0x219392ef;
      auVar151._16_4_ = 0x219392ef;
      auVar151._20_4_ = 0x219392ef;
      auVar151._24_4_ = 0x219392ef;
      auVar151._28_4_ = 0x219392ef;
      auVar126 = vcmpps_avx(auVar126,auVar151,1);
      auVar233 = ZEXT1632(auVar114);
      auVar250 = vfnmadd213ps_fma(auVar273,auVar233,auVar277);
      auVar250 = vfmadd132ps_fma(ZEXT1632(auVar250),auVar273,auVar273);
      auVar247._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
      auVar247._8_4_ = auVar114._8_4_ ^ 0x80000000;
      auVar247._12_4_ = auVar114._12_4_ ^ 0x80000000;
      auVar247._16_4_ = 0x80000000;
      auVar247._20_4_ = 0x80000000;
      auVar247._24_4_ = 0x80000000;
      auVar247._28_4_ = 0x80000000;
      auVar58._4_4_ = auVar250._4_4_ * -auVar4._4_4_;
      auVar58._0_4_ = auVar250._0_4_ * -auVar4._0_4_;
      auVar58._8_4_ = auVar250._8_4_ * -auVar4._8_4_;
      auVar58._12_4_ = auVar250._12_4_ * -auVar4._12_4_;
      auVar58._16_4_ = 0x80000000;
      auVar58._20_4_ = 0x80000000;
      auVar58._24_4_ = 0x80000000;
      auVar58._28_4_ = 0x80000000;
      auVar255 = ZEXT3264(auVar58);
      auVar273 = vcmpps_avx(auVar233,auVar247,1);
      auVar273 = vorps_avx(auVar273,auVar126);
      auVar152._8_4_ = 0xff800000;
      auVar152._0_8_ = 0xff800000ff800000;
      auVar152._12_4_ = 0xff800000;
      auVar152._16_4_ = 0xff800000;
      auVar152._20_4_ = 0xff800000;
      auVar152._24_4_ = 0xff800000;
      auVar152._28_4_ = 0xff800000;
      auVar273 = vblendvps_avx(auVar58,auVar152,auVar273);
      local_740 = vmaxps_avx(auVar11,auVar273);
      auVar274 = ZEXT3264(local_740);
      auVar273 = vcmpps_avx(auVar233,auVar247,6);
      auVar273 = vorps_avx(auVar126,auVar273);
      auVar273 = vblendvps_avx(auVar58,auVar282,auVar273);
      auVar122 = vandps_avx(local_6e0,auVar122);
      local_5a0 = vminps_avx(auVar133,auVar273);
      auVar273 = vcmpps_avx(local_740,local_5a0,2);
      auVar11 = auVar122 & auVar273;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0x7f,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar11 >> 0xbf,0) == '\0') &&
          (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar11[0x1f])
      goto LAB_012e62d0;
      auVar90._4_4_ = fStack_37c;
      auVar90._0_4_ = local_380;
      auVar90._8_4_ = fStack_378;
      auVar90._12_4_ = fStack_374;
      auVar90._16_4_ = uStack_370;
      auVar90._20_4_ = uStack_36c;
      auVar90._24_4_ = uStack_368;
      auVar90._28_4_ = uStack_364;
      auVar169._8_4_ = 0x3f800000;
      auVar169._0_8_ = 0x3f8000003f800000;
      auVar169._12_4_ = 0x3f800000;
      auVar169._16_4_ = 0x3f800000;
      auVar169._20_4_ = 0x3f800000;
      auVar169._24_4_ = 0x3f800000;
      auVar169._28_4_ = 0x3f800000;
      auVar126 = vminps_avx(auVar90,auVar169);
      auVar274 = ZEXT864(0) << 0x20;
      auVar126 = vmaxps_avx(auVar126,ZEXT832(0) << 0x20);
      auVar91._4_4_ = fStack_35c;
      auVar91._0_4_ = local_360;
      auVar91._8_4_ = fStack_358;
      auVar91._12_4_ = fStack_354;
      auVar91._16_4_ = uStack_350;
      auVar91._20_4_ = uStack_34c;
      auVar91._24_4_ = uStack_348;
      auVar91._28_4_ = uStack_344;
      auVar11 = vminps_avx(auVar91,auVar169);
      auVar11 = vmaxps_avx(auVar11,ZEXT832(0) << 0x20);
      auVar59._4_4_ = (auVar126._4_4_ + 1.0) * 0.125;
      auVar59._0_4_ = (auVar126._0_4_ + 0.0) * 0.125;
      auVar59._8_4_ = (auVar126._8_4_ + 2.0) * 0.125;
      auVar59._12_4_ = (auVar126._12_4_ + 3.0) * 0.125;
      auVar59._16_4_ = (auVar126._16_4_ + 4.0) * 0.125;
      auVar59._20_4_ = (auVar126._20_4_ + 5.0) * 0.125;
      auVar59._24_4_ = (auVar126._24_4_ + 6.0) * 0.125;
      auVar59._28_4_ = auVar126._28_4_ + 7.0;
      auVar250 = vfmadd213ps_fma(auVar59,local_7a0,local_780);
      auVar60._4_4_ = (auVar11._4_4_ + 1.0) * 0.125;
      auVar60._0_4_ = (auVar11._0_4_ + 0.0) * 0.125;
      auVar60._8_4_ = (auVar11._8_4_ + 2.0) * 0.125;
      auVar60._12_4_ = (auVar11._12_4_ + 3.0) * 0.125;
      auVar60._16_4_ = (auVar11._16_4_ + 4.0) * 0.125;
      auVar60._20_4_ = (auVar11._20_4_ + 5.0) * 0.125;
      auVar60._24_4_ = (auVar11._24_4_ + 6.0) * 0.125;
      auVar60._28_4_ = auVar11._28_4_ + 7.0;
      auVar4 = vfmadd213ps_fma(auVar60,local_7a0,local_780);
      auVar126 = vminps_avx(local_6c0,_local_7c0);
      auVar11 = vminps_avx(local_7e0,_local_800);
      auVar126 = vminps_avx(auVar126,auVar11);
      auVar126 = vsubps_avx(auVar126,local_680);
      auVar122 = vandps_avx(auVar273,auVar122);
      local_1a0 = ZEXT1632(auVar250);
      local_1c0 = ZEXT1632(auVar4);
      auVar61._4_4_ = auVar126._4_4_ * 0.99999976;
      auVar61._0_4_ = auVar126._0_4_ * 0.99999976;
      auVar61._8_4_ = auVar126._8_4_ * 0.99999976;
      auVar61._12_4_ = auVar126._12_4_ * 0.99999976;
      auVar61._16_4_ = auVar126._16_4_ * 0.99999976;
      auVar61._20_4_ = auVar126._20_4_ * 0.99999976;
      auVar61._24_4_ = auVar126._24_4_ * 0.99999976;
      auVar61._28_4_ = auVar126._28_4_;
      auVar126 = vmaxps_avx(ZEXT832(0) << 0x20,auVar61);
      auVar62._4_4_ = auVar126._4_4_ * auVar126._4_4_;
      auVar62._0_4_ = auVar126._0_4_ * auVar126._0_4_;
      auVar62._8_4_ = auVar126._8_4_ * auVar126._8_4_;
      auVar62._12_4_ = auVar126._12_4_ * auVar126._12_4_;
      auVar62._16_4_ = auVar126._16_4_ * auVar126._16_4_;
      auVar62._20_4_ = auVar126._20_4_ * auVar126._20_4_;
      auVar62._24_4_ = auVar126._24_4_ * auVar126._24_4_;
      auVar62._28_4_ = auVar126._28_4_;
      auVar273 = vsubps_avx(local_8e0,auVar62);
      auVar63._4_4_ = auVar273._4_4_ * (float)local_6a0._4_4_;
      auVar63._0_4_ = auVar273._0_4_ * (float)local_6a0._0_4_;
      auVar63._8_4_ = auVar273._8_4_ * fStack_698;
      auVar63._12_4_ = auVar273._12_4_ * fStack_694;
      auVar63._16_4_ = auVar273._16_4_ * fStack_690;
      auVar63._20_4_ = auVar273._20_4_ * fStack_68c;
      auVar63._24_4_ = auVar273._24_4_ * fStack_688;
      auVar63._28_4_ = auVar126._28_4_;
      auVar126 = vsubps_avx(local_660,auVar63);
      local_a80 = vcmpps_avx(auVar126,ZEXT832(0) << 0x20,5);
      if ((((((((local_a80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_a80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_a80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_a80 >> 0x7f,0) == '\0') &&
            (local_a80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_a80 >> 0xbf,0) == '\0') &&
          (local_a80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_a80[0x1f]) {
        auVar170 = ZEXT832(0) << 0x20;
        auVar244 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar133 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar233 = ZEXT832(0) << 0x20;
        _local_b20 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar254._8_4_ = 0x7f800000;
        auVar254._0_8_ = 0x7f8000007f800000;
        auVar254._12_4_ = 0x7f800000;
        auVar254._16_4_ = 0x7f800000;
        auVar254._20_4_ = 0x7f800000;
        auVar254._24_4_ = 0x7f800000;
        auVar254._28_4_ = 0x7f800000;
        auVar264._8_4_ = 0xff800000;
        auVar264._0_8_ = 0xff800000ff800000;
        auVar264._12_4_ = 0xff800000;
        auVar264._16_4_ = 0xff800000;
        auVar264._20_4_ = 0xff800000;
        auVar264._24_4_ = 0xff800000;
        auVar264._28_4_ = 0xff800000;
      }
      else {
        auVar133 = vrcpps_avx(local_8c0);
        auVar250 = vfnmadd213ps_fma(local_8c0,auVar133,auVar169);
        auVar233 = vsqrtps_avx(auVar126);
        auVar250 = vfmadd132ps_fma(ZEXT1632(auVar250),auVar133,auVar133);
        auVar77._8_4_ = fStack_878;
        auVar77._0_8_ = CONCAT44(fStack_87c,local_880);
        auVar77._12_4_ = fStack_874;
        auVar77._16_4_ = fStack_870;
        auVar77._20_4_ = fStack_86c;
        auVar77._24_4_ = fStack_868;
        auVar77._28_4_ = fStack_864;
        auVar234._0_8_ = CONCAT44(fStack_87c,local_880) ^ 0x8000000080000000;
        auVar234._8_4_ = -fStack_878;
        auVar234._12_4_ = -fStack_874;
        auVar234._16_4_ = -fStack_870;
        auVar234._20_4_ = -fStack_86c;
        auVar234._24_4_ = -fStack_868;
        auVar234._28_4_ = -fStack_864;
        auVar133 = vsubps_avx(auVar234,auVar233);
        auVar233 = vsubps_avx(auVar233,auVar77);
        fVar199 = auVar133._0_4_ * auVar250._0_4_;
        fVar213 = auVar133._4_4_ * auVar250._4_4_;
        auVar64._4_4_ = fVar213;
        auVar64._0_4_ = fVar199;
        fVar278 = auVar133._8_4_ * auVar250._8_4_;
        auVar64._8_4_ = fVar278;
        fVar284 = auVar133._12_4_ * auVar250._12_4_;
        auVar64._12_4_ = fVar284;
        fVar236 = auVar133._16_4_ * 0.0;
        auVar64._16_4_ = fVar236;
        fVar212 = auVar133._20_4_ * 0.0;
        auVar64._20_4_ = fVar212;
        fVar214 = auVar133._24_4_ * 0.0;
        auVar64._24_4_ = fVar214;
        auVar64._28_4_ = auVar133._28_4_;
        fVar216 = auVar233._0_4_ * auVar250._0_4_;
        fVar217 = auVar233._4_4_ * auVar250._4_4_;
        auVar65._4_4_ = fVar217;
        auVar65._0_4_ = fVar216;
        fVar107 = auVar233._8_4_ * auVar250._8_4_;
        auVar65._8_4_ = fVar107;
        fVar139 = auVar233._12_4_ * auVar250._12_4_;
        auVar65._12_4_ = fVar139;
        fVar140 = auVar233._16_4_ * 0.0;
        auVar65._16_4_ = fVar140;
        fVar141 = auVar233._20_4_ * 0.0;
        auVar65._20_4_ = fVar141;
        fVar142 = auVar233._24_4_ * 0.0;
        auVar65._24_4_ = fVar142;
        auVar65._28_4_ = auVar3._4_4_;
        auVar250 = vfmadd213ps_fma(local_320,auVar64,auVar225);
        auVar4 = vfmadd213ps_fma(local_320,auVar65,auVar225);
        auVar133 = ZEXT1632(CONCAT412(auVar250._12_4_ * fVar285,
                                      CONCAT48(auVar250._8_4_ * fVar283,
                                               CONCAT44(auVar250._4_4_ * fVar215,
                                                        auVar250._0_4_ * fVar211))));
        auVar66._28_4_ = auVar11._28_4_;
        auVar66._0_28_ =
             ZEXT1628(CONCAT412(fVar285 * auVar4._12_4_,
                                CONCAT48(fVar283 * auVar4._8_4_,
                                         CONCAT44(fVar215 * auVar4._4_4_,fVar211 * auVar4._0_4_))));
        auVar250 = vfmadd213ps_fma(local_2c0,auVar133,auVar124);
        auVar4 = vfmadd213ps_fma(local_2c0,auVar66,auVar124);
        auVar114 = vfmadd213ps_fma(local_2e0,auVar133,local_300);
        auVar275 = vfmadd213ps_fma(local_2e0,auVar66,local_300);
        auVar5 = vfmadd213ps_fma(auVar133,local_2a0,auVar239);
        auVar6 = vfmadd213ps_fma(local_2a0,auVar66,auVar239);
        auVar67._4_4_ = local_600._4_4_ * fVar213;
        auVar67._0_4_ = local_600._0_4_ * fVar199;
        auVar67._8_4_ = local_600._8_4_ * fVar278;
        auVar67._12_4_ = local_600._12_4_ * fVar284;
        auVar67._16_4_ = local_600._16_4_ * fVar236;
        auVar67._20_4_ = local_600._20_4_ * fVar212;
        auVar67._24_4_ = local_600._24_4_ * fVar214;
        auVar67._28_4_ = 0;
        auVar133 = vsubps_avx(auVar67,ZEXT1632(auVar250));
        auVar68._4_4_ = (float)local_620._4_4_ * fVar213;
        auVar68._0_4_ = (float)local_620._0_4_ * fVar199;
        auVar68._8_4_ = fStack_618 * fVar278;
        auVar68._12_4_ = fStack_614 * fVar284;
        auVar68._16_4_ = fStack_610 * fVar236;
        auVar68._20_4_ = fStack_60c * fVar212;
        auVar68._24_4_ = fStack_608 * fVar214;
        auVar68._28_4_ = 0;
        auVar233 = vsubps_avx(auVar68,ZEXT1632(auVar114));
        auVar171._0_4_ = local_640 * fVar199;
        auVar171._4_4_ = fStack_63c * fVar213;
        auVar171._8_4_ = fStack_638 * fVar278;
        auVar171._12_4_ = fStack_634 * fVar284;
        auVar171._16_4_ = fStack_630 * fVar236;
        auVar171._20_4_ = fStack_62c * fVar212;
        auVar171._24_4_ = fStack_628 * fVar214;
        auVar171._28_4_ = 0;
        auVar11 = vsubps_avx(auVar171,ZEXT1632(auVar5));
        _local_b20 = auVar11._0_28_;
        auVar69._4_4_ = local_600._4_4_ * fVar217;
        auVar69._0_4_ = local_600._0_4_ * fVar216;
        auVar69._8_4_ = local_600._8_4_ * fVar107;
        auVar69._12_4_ = local_600._12_4_ * fVar139;
        auVar69._16_4_ = local_600._16_4_ * fVar140;
        auVar69._20_4_ = local_600._20_4_ * fVar141;
        auVar69._24_4_ = local_600._24_4_ * fVar142;
        auVar69._28_4_ = auVar11._28_4_;
        auVar170 = vsubps_avx(auVar69,ZEXT1632(auVar4));
        auVar274 = ZEXT3264(auVar170);
        auVar70._4_4_ = (float)local_620._4_4_ * fVar217;
        auVar70._0_4_ = (float)local_620._0_4_ * fVar216;
        auVar70._8_4_ = fStack_618 * fVar107;
        auVar70._12_4_ = fStack_614 * fVar139;
        auVar70._16_4_ = fStack_610 * fVar140;
        auVar70._20_4_ = fStack_60c * fVar141;
        auVar70._24_4_ = fStack_608 * fVar142;
        auVar70._28_4_ = auVar11._28_4_;
        auVar170 = vsubps_avx(auVar70,ZEXT1632(auVar275));
        auVar248._0_4_ = local_640 * fVar216;
        auVar248._4_4_ = fStack_63c * fVar217;
        auVar248._8_4_ = fStack_638 * fVar107;
        auVar248._12_4_ = fStack_634 * fVar139;
        auVar248._16_4_ = fStack_630 * fVar140;
        auVar248._20_4_ = fStack_62c * fVar141;
        auVar248._24_4_ = fStack_628 * fVar142;
        auVar248._28_4_ = 0;
        auVar11 = vsubps_avx(auVar248,ZEXT1632(auVar6));
        auVar244 = auVar11._0_28_;
        auVar126 = vcmpps_avx(auVar126,_DAT_01f7b000,5);
        auVar227._8_4_ = 0x7f800000;
        auVar227._0_8_ = 0x7f8000007f800000;
        auVar227._12_4_ = 0x7f800000;
        auVar227._16_4_ = 0x7f800000;
        auVar227._20_4_ = 0x7f800000;
        auVar227._24_4_ = 0x7f800000;
        auVar227._28_4_ = 0x7f800000;
        auVar254 = vblendvps_avx(auVar227,auVar64,auVar126);
        auVar11 = vmaxps_avx(local_540,local_3a0);
        auVar71._4_4_ = auVar11._4_4_ * 1.9073486e-06;
        auVar71._0_4_ = auVar11._0_4_ * 1.9073486e-06;
        auVar71._8_4_ = auVar11._8_4_ * 1.9073486e-06;
        auVar71._12_4_ = auVar11._12_4_ * 1.9073486e-06;
        auVar71._16_4_ = auVar11._16_4_ * 1.9073486e-06;
        auVar71._20_4_ = auVar11._20_4_ * 1.9073486e-06;
        auVar71._24_4_ = auVar11._24_4_ * 1.9073486e-06;
        auVar71._28_4_ = auVar11._28_4_;
        auVar11 = vcmpps_avx(local_8a0,auVar71,1);
        auVar228._8_4_ = 0xff800000;
        auVar228._0_8_ = 0xff800000ff800000;
        auVar228._12_4_ = 0xff800000;
        auVar228._16_4_ = 0xff800000;
        auVar228._20_4_ = 0xff800000;
        auVar228._24_4_ = 0xff800000;
        auVar228._28_4_ = 0xff800000;
        auVar264 = vblendvps_avx(auVar228,auVar65,auVar126);
        auVar124 = auVar126 & auVar11;
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0x7f,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0xbf,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar124[0x1f] < '\0') {
          auVar11 = vandps_avx(auVar126,auVar11);
          auVar124 = vcmpps_avx(auVar273,_DAT_01f7b000,2);
          auVar269._8_4_ = 0xff800000;
          auVar269._0_8_ = 0xff800000ff800000;
          auVar269._12_4_ = 0xff800000;
          auVar269._16_4_ = 0xff800000;
          auVar269._20_4_ = 0xff800000;
          auVar269._24_4_ = 0xff800000;
          auVar269._28_4_ = 0xff800000;
          auVar289._8_4_ = 0x7f800000;
          auVar289._0_8_ = 0x7f8000007f800000;
          auVar289._12_4_ = 0x7f800000;
          auVar289._16_4_ = 0x7f800000;
          auVar289._20_4_ = 0x7f800000;
          auVar289._24_4_ = 0x7f800000;
          auVar289._28_4_ = 0x7f800000;
          auVar273 = vblendvps_avx(auVar289,auVar269,auVar124);
          auVar250 = vpackssdw_avx(auVar11._0_16_,auVar11._16_16_);
          auVar127 = vpmovsxwd_avx2(auVar250);
          auVar254 = vblendvps_avx(auVar254,auVar273,auVar127);
          auVar273 = vblendvps_avx(auVar269,auVar289,auVar124);
          auVar264 = vblendvps_avx(auVar264,auVar273,auVar127);
          auVar230._0_8_ = auVar11._0_8_ ^ 0xffffffffffffffff;
          auVar230._8_4_ = auVar11._8_4_ ^ 0xffffffff;
          auVar230._12_4_ = auVar11._12_4_ ^ 0xffffffff;
          auVar230._16_4_ = auVar11._16_4_ ^ 0xffffffff;
          auVar230._20_4_ = auVar11._20_4_ ^ 0xffffffff;
          auVar230._24_4_ = auVar11._24_4_ ^ 0xffffffff;
          auVar230._28_4_ = auVar11._28_4_ ^ 0xffffffff;
          auVar273 = vorps_avx(auVar124,auVar230);
          local_a80 = vandps_avx(auVar126,auVar273);
        }
      }
      uVar108 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar235._4_4_ = uVar108;
      auVar235._0_4_ = uVar108;
      auVar235._8_4_ = uVar108;
      auVar235._12_4_ = uVar108;
      auVar235._16_4_ = uVar108;
      auVar235._20_4_ = uVar108;
      auVar235._24_4_ = uVar108;
      auVar235._28_4_ = uVar108;
      uVar108 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar242._4_4_ = uVar108;
      auVar242._0_4_ = uVar108;
      auVar242._8_4_ = uVar108;
      auVar242._12_4_ = uVar108;
      auVar242._16_4_ = uVar108;
      auVar242._20_4_ = uVar108;
      auVar242._24_4_ = uVar108;
      auVar242._28_4_ = uVar108;
      auVar243 = ZEXT3264(auVar242);
      fVar199 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar270 = ZEXT3264(local_740);
      local_580 = local_740;
      local_560 = vminps_avx(local_5a0,auVar254);
      _local_5c0 = vmaxps_avx(local_740,auVar264);
      auVar266 = ZEXT3264(_local_5c0);
      auVar126 = vcmpps_avx(local_740,local_560,2);
      auVar255 = ZEXT3264(auVar126);
      local_660 = vandps_avx(auVar126,auVar122);
      auVar126 = vcmpps_avx(_local_5c0,local_5a0,2);
      local_7e0 = vandps_avx(auVar126,auVar122);
      auVar122 = vorps_avx(local_7e0,local_660);
      if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0x7f,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar122 >> 0xbf,0) == '\0') &&
          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar122[0x1f]) {
        auVar231 = ZEXT3264(local_840);
      }
      else {
        _local_7c0 = _local_5c0;
        local_8e0._0_4_ = uVar104;
        auVar72._4_4_ = auVar244._4_4_ * fVar199;
        auVar72._0_4_ = auVar244._0_4_ * fVar199;
        auVar72._8_4_ = auVar244._8_4_ * fVar199;
        auVar72._12_4_ = auVar244._12_4_ * fVar199;
        auVar72._16_4_ = auVar244._16_4_ * fVar199;
        auVar72._20_4_ = auVar244._20_4_ * fVar199;
        auVar72._24_4_ = auVar244._24_4_ * fVar199;
        auVar72._28_4_ = auVar122._28_4_;
        auVar250 = vfmadd213ps_fma(auVar170,auVar242,auVar72);
        auVar73._4_4_ = fVar199 * (float)local_b20._4_4_;
        auVar73._0_4_ = fVar199 * (float)local_b20._0_4_;
        auVar73._8_4_ = fVar199 * fStack_b18;
        auVar73._12_4_ = fVar199 * fStack_b14;
        auVar73._16_4_ = fVar199 * fStack_b10;
        auVar73._20_4_ = fVar199 * fStack_b0c;
        auVar73._24_4_ = fVar199 * fStack_b08;
        auVar73._28_4_ = auVar122._28_4_;
        auVar4 = vfmadd213ps_fma(auVar233,auVar242,auVar73);
        auVar250 = vfmadd213ps_fma(auVar274._0_32_,auVar235,ZEXT1632(auVar250));
        auVar274 = ZEXT1664(auVar250);
        auVar172._0_8_ = local_a80._0_8_ ^ 0xffffffffffffffff;
        auVar172._8_4_ = local_a80._8_4_ ^ 0xffffffff;
        auVar172._12_4_ = local_a80._12_4_ ^ 0xffffffff;
        auVar172._16_4_ = local_a80._16_4_ ^ 0xffffffff;
        auVar172._20_4_ = local_a80._20_4_ ^ 0xffffffff;
        auVar172._24_4_ = local_a80._24_4_ ^ 0xffffffff;
        auVar172._28_4_ = local_a80._28_4_ ^ 0xffffffff;
        auVar122 = vandps_avx(ZEXT1632(auVar250),local_720);
        auVar243 = ZEXT3264(local_660);
        auVar229._8_4_ = 0x3e99999a;
        auVar229._0_8_ = 0x3e99999a3e99999a;
        auVar229._12_4_ = 0x3e99999a;
        auVar229._16_4_ = 0x3e99999a;
        auVar229._20_4_ = 0x3e99999a;
        auVar229._24_4_ = 0x3e99999a;
        auVar229._28_4_ = 0x3e99999a;
        auVar122 = vcmpps_avx(auVar122,auVar229,1);
        _local_6a0 = vorps_avx(auVar122,auVar172);
        auVar250 = vfmadd213ps_fma(auVar133,auVar235,ZEXT1632(auVar4));
        auVar122 = vandps_avx(ZEXT1632(auVar250),local_720);
        auVar122 = vcmpps_avx(auVar122,auVar229,1);
        auVar122 = vorps_avx(auVar122,auVar172);
        auVar156._8_4_ = 3;
        auVar156._0_8_ = 0x300000003;
        auVar156._12_4_ = 3;
        auVar156._16_4_ = 3;
        auVar156._20_4_ = 3;
        auVar156._24_4_ = 3;
        auVar156._28_4_ = 3;
        auVar173._8_4_ = 2;
        auVar173._0_8_ = 0x200000002;
        auVar173._12_4_ = 2;
        auVar173._16_4_ = 2;
        auVar173._20_4_ = 2;
        auVar173._24_4_ = 2;
        auVar173._28_4_ = 2;
        auVar122 = vblendvps_avx(auVar173,auVar156,auVar122);
        local_6c0._4_4_ = local_b2c;
        local_6c0._0_4_ = local_b2c;
        local_6c0._8_4_ = local_b2c;
        local_6c0._12_4_ = local_b2c;
        local_6c0._16_4_ = local_b2c;
        local_6c0._20_4_ = local_b2c;
        local_6c0._24_4_ = local_b2c;
        local_6c0._28_4_ = local_b2c;
        local_680 = vpcmpgtd_avx2(auVar122,local_6c0);
        auVar122 = vpandn_avx2(local_680,local_660);
        local_800._4_4_ = local_740._4_4_ + local_840._4_4_;
        local_800._0_4_ = local_740._0_4_ + local_840._0_4_;
        fStack_7f8 = local_740._8_4_ + local_840._8_4_;
        fStack_7f4 = local_740._12_4_ + local_840._12_4_;
        fStack_7f0 = local_740._16_4_ + local_840._16_4_;
        fStack_7ec = local_740._20_4_ + local_840._20_4_;
        fStack_7e8 = local_740._24_4_ + local_840._24_4_;
        fStack_7e4 = local_740._28_4_ + local_840._28_4_;
        local_a60 = auVar12;
        local_960 = auVar13;
        local_940 = auVar16;
        while( true ) {
          local_3e0 = auVar122;
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar122 >> 0x7f,0) == '\0') &&
                (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0xbf,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar122[0x1f]) break;
          auVar157._8_4_ = 0x7f800000;
          auVar157._0_8_ = 0x7f8000007f800000;
          auVar157._12_4_ = 0x7f800000;
          auVar157._16_4_ = 0x7f800000;
          auVar157._20_4_ = 0x7f800000;
          auVar157._24_4_ = 0x7f800000;
          auVar157._28_4_ = 0x7f800000;
          auVar126 = vblendvps_avx(auVar157,auVar270._0_32_,auVar122);
          auVar273 = vshufps_avx(auVar126,auVar126,0xb1);
          auVar273 = vminps_avx(auVar126,auVar273);
          auVar11 = vshufpd_avx(auVar273,auVar273,5);
          auVar273 = vminps_avx(auVar273,auVar11);
          auVar11 = vpermpd_avx2(auVar273,0x4e);
          auVar273 = vminps_avx(auVar273,auVar11);
          auVar126 = vcmpps_avx(auVar126,auVar273,0);
          auVar273 = auVar122 & auVar126;
          if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar273 >> 0x7f,0) != '\0') ||
                (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar273 >> 0xbf,0) != '\0') ||
              (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar273[0x1f] < '\0') {
            auVar122 = vandps_avx(auVar126,auVar122);
          }
          uVar97 = vmovmskps_avx(auVar122);
          iVar14 = 0;
          for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
            iVar14 = iVar14 + 1;
          }
          uVar102 = iVar14 << 2;
          *(undefined4 *)(local_3e0 + uVar102) = 0;
          aVar1 = (ray->super_RayK<1>).dir.field_0;
          local_a80._0_16_ = (undefined1  [16])aVar1;
          auVar250 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          uVar97 = *(uint *)(local_1a0 + uVar102);
          uVar102 = *(uint *)(local_580 + uVar102);
          if (auVar250._0_4_ < 0.0) {
            auVar266 = ZEXT1664(auVar266._0_16_);
            auVar274 = ZEXT1664(auVar274._0_16_);
            fVar199 = sqrtf(auVar250._0_4_);
          }
          else {
            auVar250 = vsqrtss_avx(auVar250,auVar250);
            fVar199 = auVar250._0_4_;
          }
          auVar243 = ZEXT464(uVar102);
          auVar4 = vminps_avx(local_a10,local_a30);
          auVar250 = vmaxps_avx(local_a10,local_a30);
          auVar114 = vminps_avx(local_a20,_local_a40);
          auVar275 = vminps_avx(auVar4,auVar114);
          auVar4 = vmaxps_avx(local_a20,_local_a40);
          auVar114 = vmaxps_avx(auVar250,auVar4);
          local_980._8_4_ = 0x7fffffff;
          local_980._0_8_ = 0x7fffffff7fffffff;
          local_980._12_4_ = 0x7fffffff;
          auVar250 = vandps_avx(auVar275,local_980._0_16_);
          auVar4 = vandps_avx(auVar114,local_980._0_16_);
          auVar250 = vmaxps_avx(auVar250,auVar4);
          auVar4 = vmovshdup_avx(auVar250);
          auVar4 = vmaxss_avx(auVar4,auVar250);
          auVar250 = vshufpd_avx(auVar250,auVar250,1);
          auVar250 = vmaxss_avx(auVar250,auVar4);
          local_900 = auVar250._0_4_ * 1.9073486e-06;
          local_820._0_4_ = fVar199 * 1.9073486e-06;
          local_7a0._0_16_ = vshufps_avx(auVar114,auVar114,0xff);
          auVar250 = vinsertps_avx(ZEXT416(uVar102),ZEXT416(uVar97),0x10);
          auVar270 = ZEXT1664(auVar250);
          lVar101 = 5;
          do {
            do {
              auVar250 = auVar270._0_16_;
              bVar106 = lVar101 == 0;
              lVar101 = lVar101 + -1;
              if (bVar106) goto LAB_012e7007;
              local_9e0._0_16_ = vmovshdup_avx(auVar250);
              fVar211 = local_9e0._0_4_;
              fVar283 = 1.0 - fVar211;
              fVar215 = fVar283 * fVar283 * fVar283;
              fVar278 = fVar211 * fVar211;
              fVar213 = fVar211 * fVar278;
              auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                         ZEXT416((uint)fVar213));
              fVar199 = fVar211 * fVar283;
              auVar275 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar199 * 6.0)),
                                         ZEXT416((uint)(fVar283 * fVar199)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar283 * fVar199 * 6.0)),
                                       SUB6416(ZEXT464(0x41400000),0),
                                       ZEXT416((uint)(fVar211 * fVar199)));
              auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                       ZEXT416((uint)fVar215));
              fVar211 = (auVar4._0_4_ + auVar5._0_4_) * 0.16666667;
              fVar213 = fVar213 * 0.16666667;
              auVar145._0_4_ = fVar213 * (float)local_a40._0_4_;
              auVar145._4_4_ = fVar213 * (float)local_a40._4_4_;
              auVar145._8_4_ = fVar213 * fStack_a38;
              auVar145._12_4_ = fVar213 * fStack_a34;
              auVar180._4_4_ = fVar211;
              auVar180._0_4_ = fVar211;
              auVar180._8_4_ = fVar211;
              auVar180._12_4_ = fVar211;
              auVar4 = vfmadd132ps_fma(auVar180,auVar145,local_a20);
              fVar211 = (auVar114._0_4_ + auVar275._0_4_) * 0.16666667;
              auVar146._4_4_ = fVar211;
              auVar146._0_4_ = fVar211;
              auVar146._8_4_ = fVar211;
              auVar146._12_4_ = fVar211;
              auVar4 = vfmadd132ps_fma(auVar146,auVar4,local_a30);
              fVar213 = auVar270._0_4_;
              auVar160._4_4_ = fVar213;
              auVar160._0_4_ = fVar213;
              auVar160._8_4_ = fVar213;
              auVar160._12_4_ = fVar213;
              auVar114 = vfmadd213ps_fma(auVar160,local_a80._0_16_,_DAT_01f45a50);
              fVar215 = fVar215 * 0.16666667;
              auVar113._4_4_ = fVar215;
              auVar113._0_4_ = fVar215;
              auVar113._8_4_ = fVar215;
              auVar113._12_4_ = fVar215;
              auVar4 = vfmadd132ps_fma(auVar113,auVar4,local_a10);
              local_760._0_16_ = auVar4;
              auVar4 = vsubps_avx(auVar114,auVar4);
              local_880 = auVar4._0_4_;
              fStack_87c = auVar4._4_4_;
              fStack_878 = auVar4._8_4_;
              fStack_874 = auVar4._12_4_;
              auVar4 = vdpps_avx(auVar4,auVar4,0x7f);
              fVar211 = auVar4._0_4_;
              if (fVar211 < 0.0) {
                local_a00._0_16_ = ZEXT416((uint)fVar283);
                local_920._0_4_ = fVar278;
                local_a60._0_4_ = fVar199;
                auVar231._0_4_ = sqrtf(fVar211);
                auVar231._4_60_ = extraout_var;
                auVar114 = auVar231._0_16_;
                fVar278 = (float)local_920._0_4_;
                fVar199 = (float)local_a60._0_4_;
                auVar275 = local_a00._0_16_;
              }
              else {
                auVar114 = vsqrtss_avx(auVar4,auVar4);
                auVar275 = ZEXT416((uint)fVar283);
              }
              fVar215 = auVar275._0_4_;
              auVar115._4_4_ = fVar215;
              auVar115._0_4_ = fVar215;
              auVar115._8_4_ = fVar215;
              auVar115._12_4_ = fVar215;
              auVar6 = vfnmsub213ss_fma(local_9e0._0_16_,local_9e0._0_16_,
                                        ZEXT416((uint)(fVar199 * 4.0)));
              auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * 4.0)),auVar275,auVar275);
              fVar199 = fVar215 * -fVar215 * 0.5;
              fVar215 = auVar6._0_4_ * 0.5;
              fVar283 = auVar5._0_4_ * 0.5;
              fVar278 = fVar278 * 0.5;
              auVar221._0_4_ = (float)local_a40._0_4_ * fVar278;
              auVar221._4_4_ = (float)local_a40._4_4_ * fVar278;
              auVar221._8_4_ = fStack_a38 * fVar278;
              auVar221._12_4_ = fStack_a34 * fVar278;
              auVar181._4_4_ = fVar283;
              auVar181._0_4_ = fVar283;
              auVar181._8_4_ = fVar283;
              auVar181._12_4_ = fVar283;
              auVar5 = vfmadd213ps_fma(auVar181,local_a20,auVar221);
              auVar200._4_4_ = fVar215;
              auVar200._0_4_ = fVar215;
              auVar200._8_4_ = fVar215;
              auVar200._12_4_ = fVar215;
              auVar5 = vfmadd213ps_fma(auVar200,local_a30,auVar5);
              auVar262._4_4_ = fVar199;
              auVar262._0_4_ = fVar199;
              auVar262._8_4_ = fVar199;
              auVar262._12_4_ = fVar199;
              auVar7 = vfmadd213ps_fma(auVar262,local_a10,auVar5);
              auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar275,local_9e0._0_16_);
              auVar6 = vfmadd213ss_fma(local_9e0._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar275);
              auVar275 = vshufps_avx(auVar250,auVar250,0x55);
              auVar182._0_4_ = (float)local_a40._0_4_ * auVar275._0_4_;
              auVar182._4_4_ = (float)local_a40._4_4_ * auVar275._4_4_;
              auVar182._8_4_ = fStack_a38 * auVar275._8_4_;
              auVar182._12_4_ = fStack_a34 * auVar275._12_4_;
              uVar104 = auVar6._0_4_;
              auVar201._4_4_ = uVar104;
              auVar201._0_4_ = uVar104;
              auVar201._8_4_ = uVar104;
              auVar201._12_4_ = uVar104;
              auVar275 = vfmadd213ps_fma(auVar201,local_a20,auVar182);
              auVar161._0_4_ = auVar5._0_4_;
              auVar161._4_4_ = auVar161._0_4_;
              auVar161._8_4_ = auVar161._0_4_;
              auVar161._12_4_ = auVar161._0_4_;
              auVar275 = vfmadd213ps_fma(auVar161,local_a30,auVar275);
              auVar163 = vfmadd231ps_fma(auVar275,local_a10,auVar115);
              auVar5 = vdpps_avx(auVar7,auVar7,0x7f);
              auVar275 = vblendps_avx(auVar5,_DAT_01f45a50,0xe);
              auVar6 = vrsqrtss_avx(auVar275,auVar275);
              fVar199 = auVar6._0_4_;
              fVar278 = auVar5._0_4_;
              fVar199 = fVar199 * 1.5 + fVar278 * -0.5 * fVar199 * fVar199 * fVar199;
              auVar6 = vdpps_avx(auVar7,auVar163,0x7f);
              auVar162._0_4_ = auVar163._0_4_ * fVar278;
              auVar162._4_4_ = auVar163._4_4_ * fVar278;
              auVar162._8_4_ = auVar163._8_4_ * fVar278;
              auVar162._12_4_ = auVar163._12_4_ * fVar278;
              fVar215 = auVar6._0_4_;
              auVar222._0_4_ = auVar7._0_4_ * fVar215;
              auVar222._4_4_ = auVar7._4_4_ * fVar215;
              fVar283 = auVar7._8_4_;
              auVar222._8_4_ = fVar283 * fVar215;
              fVar284 = auVar7._12_4_;
              auVar222._12_4_ = fVar284 * fVar215;
              auVar6 = vsubps_avx(auVar162,auVar222);
              auVar275 = vrcpss_avx(auVar275,auVar275);
              auVar163 = vfnmadd213ss_fma(auVar275,auVar5,ZEXT416(0x40000000));
              fVar215 = auVar275._0_4_ * auVar163._0_4_;
              auVar275 = vmaxss_avx(ZEXT416((uint)local_900),
                                    ZEXT416((uint)(fVar213 * (float)local_820._0_4_)));
              auVar231 = ZEXT1664(auVar275);
              auVar237._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
              auVar237._8_4_ = -fVar283;
              auVar237._12_4_ = -fVar284;
              auVar183._0_4_ = fVar199 * auVar6._0_4_ * fVar215;
              auVar183._4_4_ = fVar199 * auVar6._4_4_ * fVar215;
              auVar183._8_4_ = fVar199 * auVar6._8_4_ * fVar215;
              auVar183._12_4_ = fVar199 * auVar6._12_4_ * fVar215;
              auVar251._0_4_ = auVar7._0_4_ * fVar199;
              auVar251._4_4_ = auVar7._4_4_ * fVar199;
              auVar251._8_4_ = fVar283 * fVar199;
              auVar251._12_4_ = fVar284 * fVar199;
              local_9e0._0_16_ = auVar7;
              local_a00._0_4_ = auVar275._0_4_;
              if (fVar278 < -fVar278) {
                local_920._0_4_ = auVar114._0_4_;
                local_a60._0_16_ = auVar237;
                local_940._0_16_ = auVar251;
                local_960._0_16_ = auVar183;
                fVar199 = sqrtf(fVar278);
                auVar231 = ZEXT464((uint)local_a00._0_4_);
                auVar114 = ZEXT416((uint)local_920._0_4_);
                auVar183 = local_960._0_16_;
                auVar237 = local_a60._0_16_;
                auVar251 = local_940._0_16_;
              }
              else {
                auVar275 = vsqrtss_avx(auVar5,auVar5);
                fVar199 = auVar275._0_4_;
              }
              auVar74._4_4_ = fStack_87c;
              auVar74._0_4_ = local_880;
              auVar74._8_4_ = fStack_878;
              auVar74._12_4_ = fStack_874;
              auVar275 = vdpps_avx(auVar74,auVar251,0x7f);
              auVar163 = vfmadd213ss_fma(ZEXT416((uint)local_900),auVar114,auVar231._0_16_);
              auVar5 = vdpps_avx(auVar237,auVar251,0x7f);
              auVar6 = vdpps_avx(auVar74,auVar183,0x7f);
              auVar7 = vdpps_avx(local_a80._0_16_,auVar251,0x7f);
              auVar163 = vfmadd213ss_fma(ZEXT416((uint)(auVar114._0_4_ + 1.0)),
                                         ZEXT416((uint)(local_900 / fVar199)),auVar163);
              fVar199 = auVar5._0_4_ + auVar6._0_4_;
              auVar274 = ZEXT464((uint)fVar199);
              auVar116._0_4_ = auVar275._0_4_ * auVar275._0_4_;
              auVar116._4_4_ = auVar275._4_4_ * auVar275._4_4_;
              auVar116._8_4_ = auVar275._8_4_ * auVar275._8_4_;
              auVar116._12_4_ = auVar275._12_4_ * auVar275._12_4_;
              auVar114 = vdpps_avx(auVar74,auVar237,0x7f);
              auVar6 = vsubps_avx(auVar4,auVar116);
              auVar5 = vrsqrtss_avx(auVar6,auVar6);
              fVar215 = auVar6._0_4_;
              fVar213 = auVar5._0_4_;
              fVar213 = fVar213 * 1.5 + fVar215 * -0.5 * fVar213 * fVar213 * fVar213;
              auVar5 = vdpps_avx(auVar74,local_a80._0_16_,0x7f);
              auVar114 = vfnmadd231ss_fma(auVar114,auVar275,ZEXT416((uint)fVar199));
              auVar5 = vfnmadd231ss_fma(auVar5,auVar275,auVar7);
              if (fVar215 < 0.0) {
                local_920._0_16_ = auVar275;
                local_a60._0_4_ = auVar163._0_4_;
                local_940._0_16_ = ZEXT416((uint)fVar199);
                local_960._0_16_ = auVar7;
                local_8a0._0_16_ = auVar114;
                local_8c0._0_4_ = fVar213;
                local_780._0_16_ = auVar5;
                fVar199 = sqrtf(fVar215);
                auVar274 = ZEXT1664(local_940._0_16_);
                auVar231 = ZEXT464((uint)local_a00._0_4_);
                fVar213 = (float)local_8c0._0_4_;
                auVar5 = local_780._0_16_;
                auVar114 = local_8a0._0_16_;
                auVar275 = local_920._0_16_;
                auVar7 = local_960._0_16_;
                fVar215 = (float)local_a60._0_4_;
              }
              else {
                auVar6 = vsqrtss_avx(auVar6,auVar6);
                fVar199 = auVar6._0_4_;
                fVar215 = auVar163._0_4_;
              }
              auVar266 = ZEXT1664(auVar275);
              auVar243 = ZEXT1664(local_9e0._0_16_);
              auVar6 = vpermilps_avx(local_760._0_16_,0xff);
              fVar199 = fVar199 - auVar6._0_4_;
              auVar6 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
              auVar114 = vfmsub213ss_fma(auVar114,ZEXT416((uint)fVar213),auVar6);
              auVar184._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
              auVar184._8_4_ = auVar7._8_4_ ^ 0x80000000;
              auVar184._12_4_ = auVar7._12_4_ ^ 0x80000000;
              auVar202._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
              auVar202._8_4_ = auVar114._8_4_ ^ 0x80000000;
              auVar202._12_4_ = auVar114._12_4_ ^ 0x80000000;
              auVar163 = ZEXT416((uint)(auVar5._0_4_ * fVar213));
              auVar110 = auVar274._0_16_;
              auVar5 = vfmsub231ss_fma(ZEXT416((uint)(auVar7._0_4_ * auVar114._0_4_)),auVar110,
                                       auVar163);
              auVar114 = vinsertps_avx(auVar202,auVar163,0x1c);
              uVar104 = auVar5._0_4_;
              auVar203._4_4_ = uVar104;
              auVar203._0_4_ = uVar104;
              auVar203._8_4_ = uVar104;
              auVar203._12_4_ = uVar104;
              auVar114 = vdivps_avx(auVar114,auVar203);
              auVar5 = vinsertps_avx(auVar110,auVar184,0x10);
              auVar5 = vdivps_avx(auVar5,auVar203);
              fVar213 = auVar275._0_4_;
              auVar164._0_4_ = fVar213 * auVar114._0_4_ + fVar199 * auVar5._0_4_;
              auVar164._4_4_ = fVar213 * auVar114._4_4_ + fVar199 * auVar5._4_4_;
              auVar164._8_4_ = fVar213 * auVar114._8_4_ + fVar199 * auVar5._8_4_;
              auVar164._12_4_ = fVar213 * auVar114._12_4_ + fVar199 * auVar5._12_4_;
              auVar114 = vsubps_avx(auVar250,auVar164);
              auVar270 = ZEXT1664(auVar114);
              auVar250 = vandps_avx(auVar275,local_980._0_16_);
            } while (fVar215 <= auVar250._0_4_);
            auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar231._0_4_ + fVar215)),local_7a0._0_16_,
                                     ZEXT416(0x36000000));
            auVar250 = vandps_avx(ZEXT416((uint)fVar199),local_980._0_16_);
          } while (auVar5._0_4_ <= auVar250._0_4_);
          fVar199 = auVar114._0_4_ + (float)local_860._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar199) &&
             (fVar213 = (ray->super_RayK<1>).tfar, fVar199 <= fVar213)) {
            auVar250 = vmovshdup_avx(auVar114);
            fVar215 = auVar250._0_4_;
            if ((0.0 <= fVar215) && (fVar215 <= 1.0)) {
              auVar250 = vrsqrtss_avx(auVar4,auVar4);
              fVar278 = auVar250._0_4_;
              pGVar9 = (context->scene->geometries).items[uVar98].ptr;
              if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar211 = fVar278 * 1.5 + fVar211 * -0.5 * fVar278 * fVar278 * fVar278;
                auVar185._0_4_ = fVar211 * local_880;
                auVar185._4_4_ = fVar211 * fStack_87c;
                auVar185._8_4_ = fVar211 * fStack_878;
                auVar185._12_4_ = fVar211 * fStack_874;
                auVar5 = vfmadd213ps_fma(auVar6,auVar185,local_9e0._0_16_);
                auVar250 = vshufps_avx(auVar185,auVar185,0xc9);
                auVar4 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                auVar186._0_4_ = auVar185._0_4_ * auVar4._0_4_;
                auVar186._4_4_ = auVar185._4_4_ * auVar4._4_4_;
                auVar186._8_4_ = auVar185._8_4_ * auVar4._8_4_;
                auVar186._12_4_ = auVar185._12_4_ * auVar4._12_4_;
                auVar114 = vfmsub231ps_fma(auVar186,local_9e0._0_16_,auVar250);
                auVar250 = vshufps_avx(auVar114,auVar114,0xc9);
                auVar4 = vshufps_avx(auVar5,auVar5,0xc9);
                auVar114 = vshufps_avx(auVar114,auVar114,0xd2);
                auVar117._0_4_ = auVar5._0_4_ * auVar114._0_4_;
                auVar117._4_4_ = auVar5._4_4_ * auVar114._4_4_;
                auVar117._8_4_ = auVar5._8_4_ * auVar114._8_4_;
                auVar117._12_4_ = auVar5._12_4_ * auVar114._12_4_;
                auVar4 = vfmsub231ps_fma(auVar117,auVar250,auVar4);
                auVar250 = vshufps_avx(auVar4,auVar4,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar199;
                  uVar109 = vmovlps_avx(auVar250);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar109;
                  (ray->Ng).field_0.field_0.z = auVar4._0_4_;
                  ray->u = fVar215;
                  ray->v = 0.0;
                  ray->primID = local_8e0._0_4_;
                  ray->geomID = uVar98;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_9b0 = vmovlps_avx(auVar250);
                  local_9a8 = auVar4._0_4_;
                  local_9a4 = fVar215;
                  local_9a0 = 0;
                  local_99c = local_8e0._0_4_;
                  local_998 = uVar98;
                  local_994 = context->user->instID[0];
                  local_990 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar199;
                  local_700._0_4_ = 0xffffffff;
                  local_ab8.valid = (int *)local_700;
                  local_ab8.geometryUserPtr = pGVar9->userPtr;
                  local_ab8.context = context->user;
                  local_ab8.hit = (RTCHitN *)&local_9b0;
                  local_ab8.N = 1;
                  local_ab8.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012e7120:
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      auVar266 = ZEXT1664(auVar266._0_16_);
                      auVar274 = ZEXT1664(auVar274._0_16_);
                      (*p_Var10)(&local_ab8);
                      if (*local_ab8.valid == 0) goto LAB_012e71bc;
                    }
                    (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).components[0] =
                         *(float *)local_ab8.hit;
                    (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_ab8.hit + 4);
                    (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_ab8.hit + 8);
                    *(float *)((long)local_ab8.ray + 0x3c) = *(float *)(local_ab8.hit + 0xc);
                    *(float *)((long)local_ab8.ray + 0x40) = *(float *)(local_ab8.hit + 0x10);
                    *(float *)((long)local_ab8.ray + 0x44) = *(float *)(local_ab8.hit + 0x14);
                    *(float *)((long)local_ab8.ray + 0x48) = *(float *)(local_ab8.hit + 0x18);
                    *(float *)((long)local_ab8.ray + 0x4c) = *(float *)(local_ab8.hit + 0x1c);
                    *(float *)((long)local_ab8.ray + 0x50) = *(float *)(local_ab8.hit + 0x20);
                  }
                  else {
                    auVar243 = ZEXT1664(local_9e0._0_16_);
                    auVar266 = ZEXT1664(auVar275);
                    auVar274 = ZEXT1664(auVar110);
                    (*pGVar9->intersectionFilterN)(&local_ab8);
                    if (*local_ab8.valid != 0) goto LAB_012e7120;
LAB_012e71bc:
                    (ray->super_RayK<1>).tfar = fVar213;
                  }
                }
              }
            }
          }
LAB_012e7007:
          fVar199 = (ray->super_RayK<1>).tfar;
          auVar134._4_4_ = fVar199;
          auVar134._0_4_ = fVar199;
          auVar134._8_4_ = fVar199;
          auVar134._12_4_ = fVar199;
          auVar134._16_4_ = fVar199;
          auVar134._20_4_ = fVar199;
          auVar134._24_4_ = fVar199;
          auVar134._28_4_ = fVar199;
          auVar122 = vcmpps_avx(_local_800,auVar134,2);
          auVar122 = vandps_avx(auVar122,local_3e0);
          auVar270 = ZEXT3264(local_740);
        }
        auVar135._0_4_ = local_840._0_4_ + (float)local_7c0._0_4_;
        auVar135._4_4_ = local_840._4_4_ + (float)local_7c0._4_4_;
        auVar135._8_4_ = local_840._8_4_ + fStack_7b8;
        auVar135._12_4_ = local_840._12_4_ + fStack_7b4;
        auVar135._16_4_ = local_840._16_4_ + fStack_7b0;
        auVar135._20_4_ = local_840._20_4_ + fStack_7ac;
        auVar135._24_4_ = local_840._24_4_ + fStack_7a8;
        auVar135._28_4_ = local_840._28_4_ + fStack_7a4;
        fVar211 = (ray->super_RayK<1>).tfar;
        fVar199 = (ray->super_RayK<1>).tfar;
        auVar174._4_4_ = fVar199;
        auVar174._0_4_ = fVar199;
        auVar174._8_4_ = fVar199;
        auVar174._12_4_ = fVar199;
        auVar174._16_4_ = fVar199;
        auVar174._20_4_ = fVar199;
        auVar174._24_4_ = fVar199;
        auVar174._28_4_ = fVar199;
        auVar122 = vcmpps_avx(auVar135,auVar174,2);
        local_7e0 = vandps_avx(auVar122,local_7e0);
        auVar136._8_4_ = 3;
        auVar136._0_8_ = 0x300000003;
        auVar136._12_4_ = 3;
        auVar136._16_4_ = 3;
        auVar136._20_4_ = 3;
        auVar136._24_4_ = 3;
        auVar136._28_4_ = 3;
        auVar175._8_4_ = 2;
        auVar175._0_8_ = 0x200000002;
        auVar175._12_4_ = 2;
        auVar175._16_4_ = 2;
        auVar175._20_4_ = 2;
        auVar175._24_4_ = 2;
        auVar175._28_4_ = 2;
        auVar122 = vblendvps_avx(auVar175,auVar136,_local_6a0);
        _local_800 = vpcmpgtd_avx2(auVar122,local_6c0);
        auVar122 = vpandn_avx2(_local_800,local_7e0);
        local_740 = _local_5c0;
        local_7c0._4_4_ = local_840._4_4_ + (float)local_5c0._4_4_;
        local_7c0._0_4_ = local_840._0_4_ + (float)local_5c0._0_4_;
        fStack_7b8 = local_840._8_4_ + fStack_5b8;
        fStack_7b4 = local_840._12_4_ + fStack_5b4;
        fStack_7b0 = local_840._16_4_ + fStack_5b0;
        fStack_7ac = local_840._20_4_ + fStack_5ac;
        fStack_7a8 = local_840._24_4_ + fStack_5a8;
        fStack_7a4 = local_840._28_4_ + fStack_5a4;
        while( true ) {
          auVar255 = ZEXT3264(auVar288);
          auVar231 = ZEXT3264(local_840);
          local_700 = auVar122;
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar122 >> 0x7f,0) == '\0') &&
                (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0xbf,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar122[0x1f]) break;
          auVar158._8_4_ = 0x7f800000;
          auVar158._0_8_ = 0x7f8000007f800000;
          auVar158._12_4_ = 0x7f800000;
          auVar158._16_4_ = 0x7f800000;
          auVar158._20_4_ = 0x7f800000;
          auVar158._24_4_ = 0x7f800000;
          auVar158._28_4_ = 0x7f800000;
          auVar126 = vblendvps_avx(auVar158,local_740,auVar122);
          auVar273 = vshufps_avx(auVar126,auVar126,0xb1);
          auVar273 = vminps_avx(auVar126,auVar273);
          auVar11 = vshufpd_avx(auVar273,auVar273,5);
          auVar273 = vminps_avx(auVar273,auVar11);
          auVar11 = vpermpd_avx2(auVar273,0x4e);
          auVar273 = vminps_avx(auVar273,auVar11);
          auVar126 = vcmpps_avx(auVar126,auVar273,0);
          auVar273 = auVar122 & auVar126;
          if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar273 >> 0x7f,0) != '\0') ||
                (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar273 >> 0xbf,0) != '\0') ||
              (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar273[0x1f] < '\0') {
            auVar122 = vandps_avx(auVar126,auVar122);
          }
          uVar97 = vmovmskps_avx(auVar122);
          iVar14 = 0;
          for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
            iVar14 = iVar14 + 1;
          }
          uVar102 = iVar14 << 2;
          *(undefined4 *)(local_700 + uVar102) = 0;
          aVar1 = (ray->super_RayK<1>).dir.field_0;
          local_a80._0_16_ = (undefined1  [16])aVar1;
          auVar250 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          uVar97 = *(uint *)(local_1c0 + uVar102);
          uVar102 = *(uint *)(local_5a0 + uVar102);
          if (auVar250._0_4_ < 0.0) {
            auVar270 = ZEXT1664(auVar270._0_16_);
            auVar274 = ZEXT1664(auVar274._0_16_);
            fVar199 = sqrtf(auVar250._0_4_);
          }
          else {
            auVar250 = vsqrtss_avx(auVar250,auVar250);
            fVar199 = auVar250._0_4_;
          }
          auVar243 = ZEXT464(uVar102);
          auVar4 = vminps_avx(local_a10,local_a30);
          auVar250 = vmaxps_avx(local_a10,local_a30);
          auVar114 = vminps_avx(local_a20,_local_a40);
          auVar275 = vminps_avx(auVar4,auVar114);
          auVar4 = vmaxps_avx(local_a20,_local_a40);
          auVar114 = vmaxps_avx(auVar250,auVar4);
          local_820._8_4_ = NAN;
          local_820._0_8_ = 0x7fffffff7fffffff;
          local_820._12_4_ = NAN;
          auVar250 = vandps_avx(auVar275,local_820._0_16_);
          auVar4 = vandps_avx(auVar114,local_820._0_16_);
          auVar250 = vmaxps_avx(auVar250,auVar4);
          auVar4 = vmovshdup_avx(auVar250);
          auVar4 = vmaxss_avx(auVar4,auVar250);
          auVar250 = vshufpd_avx(auVar250,auVar250,1);
          auVar250 = vmaxss_avx(auVar250,auVar4);
          local_900 = auVar250._0_4_ * 1.9073486e-06;
          local_920._0_4_ = fVar199 * 1.9073486e-06;
          local_7a0._0_16_ = vshufps_avx(auVar114,auVar114,0xff);
          auVar250 = vinsertps_avx(ZEXT416(uVar102),ZEXT416(uVar97),0x10);
          auVar266 = ZEXT1664(auVar250);
          lVar101 = 5;
          do {
            do {
              auVar250 = auVar266._0_16_;
              bVar106 = lVar101 == 0;
              lVar101 = lVar101 + -1;
              if (bVar106) goto LAB_012e7a44;
              local_9e0._0_16_ = vmovshdup_avx(auVar250);
              fVar211 = local_9e0._0_4_;
              fVar283 = 1.0 - fVar211;
              fVar215 = fVar283 * fVar283 * fVar283;
              fVar278 = fVar211 * fVar211;
              fVar213 = fVar211 * fVar278;
              auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                         ZEXT416((uint)fVar213));
              fVar199 = fVar211 * fVar283;
              auVar275 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar199 * 6.0)),
                                         ZEXT416((uint)(fVar283 * fVar199)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar283 * fVar199 * 6.0)),
                                       SUB6416(ZEXT464(0x41400000),0),
                                       ZEXT416((uint)(fVar211 * fVar199)));
              auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                       ZEXT416((uint)fVar215));
              fVar211 = (auVar4._0_4_ + auVar5._0_4_) * 0.16666667;
              fVar213 = fVar213 * 0.16666667;
              auVar147._0_4_ = fVar213 * (float)local_a40._0_4_;
              auVar147._4_4_ = fVar213 * (float)local_a40._4_4_;
              auVar147._8_4_ = fVar213 * fStack_a38;
              auVar147._12_4_ = fVar213 * fStack_a34;
              auVar187._4_4_ = fVar211;
              auVar187._0_4_ = fVar211;
              auVar187._8_4_ = fVar211;
              auVar187._12_4_ = fVar211;
              auVar4 = vfmadd132ps_fma(auVar187,auVar147,local_a20);
              fVar211 = (auVar114._0_4_ + auVar275._0_4_) * 0.16666667;
              auVar148._4_4_ = fVar211;
              auVar148._0_4_ = fVar211;
              auVar148._8_4_ = fVar211;
              auVar148._12_4_ = fVar211;
              auVar4 = vfmadd132ps_fma(auVar148,auVar4,local_a30);
              fVar213 = auVar266._0_4_;
              auVar165._4_4_ = fVar213;
              auVar165._0_4_ = fVar213;
              auVar165._8_4_ = fVar213;
              auVar165._12_4_ = fVar213;
              auVar114 = vfmadd213ps_fma(auVar165,local_a80._0_16_,_DAT_01f45a50);
              fVar215 = fVar215 * 0.16666667;
              auVar118._4_4_ = fVar215;
              auVar118._0_4_ = fVar215;
              auVar118._8_4_ = fVar215;
              auVar118._12_4_ = fVar215;
              auVar4 = vfmadd132ps_fma(auVar118,auVar4,local_a10);
              local_760._0_16_ = auVar4;
              auVar4 = vsubps_avx(auVar114,auVar4);
              local_880 = auVar4._0_4_;
              fStack_87c = auVar4._4_4_;
              fStack_878 = auVar4._8_4_;
              fStack_874 = auVar4._12_4_;
              auVar4 = vdpps_avx(auVar4,auVar4,0x7f);
              fVar211 = auVar4._0_4_;
              if (fVar211 < 0.0) {
                local_a00._0_16_ = ZEXT416((uint)fVar283);
                local_980._0_4_ = fVar278;
                local_a60._0_4_ = fVar199;
                auVar274._0_4_ = sqrtf(fVar211);
                auVar274._4_60_ = extraout_var_00;
                auVar114 = auVar274._0_16_;
                fVar278 = (float)local_980._0_4_;
                fVar199 = (float)local_a60._0_4_;
                auVar275 = local_a00._0_16_;
              }
              else {
                auVar114 = vsqrtss_avx(auVar4,auVar4);
                auVar275 = ZEXT416((uint)fVar283);
              }
              fVar215 = auVar275._0_4_;
              auVar119._4_4_ = fVar215;
              auVar119._0_4_ = fVar215;
              auVar119._8_4_ = fVar215;
              auVar119._12_4_ = fVar215;
              auVar6 = vfnmsub213ss_fma(local_9e0._0_16_,local_9e0._0_16_,
                                        ZEXT416((uint)(fVar199 * 4.0)));
              auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * 4.0)),auVar275,auVar275);
              fVar199 = fVar215 * -fVar215 * 0.5;
              fVar215 = auVar6._0_4_ * 0.5;
              fVar283 = auVar5._0_4_ * 0.5;
              fVar278 = fVar278 * 0.5;
              auVar223._0_4_ = (float)local_a40._0_4_ * fVar278;
              auVar223._4_4_ = (float)local_a40._4_4_ * fVar278;
              auVar223._8_4_ = fStack_a38 * fVar278;
              auVar223._12_4_ = fStack_a34 * fVar278;
              auVar188._4_4_ = fVar283;
              auVar188._0_4_ = fVar283;
              auVar188._8_4_ = fVar283;
              auVar188._12_4_ = fVar283;
              auVar5 = vfmadd213ps_fma(auVar188,local_a20,auVar223);
              auVar204._4_4_ = fVar215;
              auVar204._0_4_ = fVar215;
              auVar204._8_4_ = fVar215;
              auVar204._12_4_ = fVar215;
              auVar5 = vfmadd213ps_fma(auVar204,local_a30,auVar5);
              auVar252._4_4_ = fVar199;
              auVar252._0_4_ = fVar199;
              auVar252._8_4_ = fVar199;
              auVar252._12_4_ = fVar199;
              auVar7 = vfmadd213ps_fma(auVar252,local_a10,auVar5);
              auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar275,local_9e0._0_16_);
              auVar110 = vfmadd213ss_fma(local_9e0._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar275);
              auVar274 = ZEXT1664(auVar110);
              auVar275 = vshufps_avx(auVar250,auVar250,0x55);
              auVar189._0_4_ = (float)local_a40._0_4_ * auVar275._0_4_;
              auVar189._4_4_ = (float)local_a40._4_4_ * auVar275._4_4_;
              auVar189._8_4_ = fStack_a38 * auVar275._8_4_;
              auVar189._12_4_ = fStack_a34 * auVar275._12_4_;
              uVar104 = auVar110._0_4_;
              auVar205._4_4_ = uVar104;
              auVar205._0_4_ = uVar104;
              auVar205._8_4_ = uVar104;
              auVar205._12_4_ = uVar104;
              auVar275 = vfmadd213ps_fma(auVar205,local_a20,auVar189);
              auVar166._0_4_ = auVar5._0_4_;
              auVar166._4_4_ = auVar166._0_4_;
              auVar166._8_4_ = auVar166._0_4_;
              auVar166._12_4_ = auVar166._0_4_;
              auVar275 = vfmadd213ps_fma(auVar166,local_a30,auVar275);
              auVar163 = vfmadd231ps_fma(auVar275,local_a10,auVar119);
              auVar5 = vdpps_avx(auVar7,auVar7,0x7f);
              auVar275 = vblendps_avx(auVar5,_DAT_01f45a50,0xe);
              auVar6 = vrsqrtss_avx(auVar275,auVar275);
              fVar199 = auVar6._0_4_;
              fVar278 = auVar5._0_4_;
              fVar199 = fVar199 * 1.5 + fVar278 * -0.5 * fVar199 * fVar199 * fVar199;
              auVar6 = vdpps_avx(auVar7,auVar163,0x7f);
              auVar167._0_4_ = auVar163._0_4_ * fVar278;
              auVar167._4_4_ = auVar163._4_4_ * fVar278;
              auVar167._8_4_ = auVar163._8_4_ * fVar278;
              auVar167._12_4_ = auVar163._12_4_ * fVar278;
              fVar215 = auVar6._0_4_;
              auVar224._0_4_ = auVar7._0_4_ * fVar215;
              auVar224._4_4_ = auVar7._4_4_ * fVar215;
              fVar283 = auVar7._8_4_;
              auVar224._8_4_ = fVar283 * fVar215;
              fVar284 = auVar7._12_4_;
              auVar224._12_4_ = fVar284 * fVar215;
              auVar6 = vsubps_avx(auVar167,auVar224);
              auVar275 = vrcpss_avx(auVar275,auVar275);
              auVar163 = vfnmadd213ss_fma(auVar275,auVar5,ZEXT416(0x40000000));
              fVar215 = auVar275._0_4_ * auVar163._0_4_;
              auVar275 = vmaxss_avx(ZEXT416((uint)local_900),
                                    ZEXT416((uint)(fVar213 * (float)local_920._0_4_)));
              auVar231 = ZEXT1664(auVar275);
              auVar263._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
              auVar263._8_4_ = -fVar283;
              auVar263._12_4_ = -fVar284;
              auVar190._0_4_ = fVar199 * auVar6._0_4_ * fVar215;
              auVar190._4_4_ = fVar199 * auVar6._4_4_ * fVar215;
              auVar190._8_4_ = fVar199 * auVar6._8_4_ * fVar215;
              auVar190._12_4_ = fVar199 * auVar6._12_4_ * fVar215;
              auVar238._0_4_ = auVar7._0_4_ * fVar199;
              auVar238._4_4_ = auVar7._4_4_ * fVar199;
              auVar238._8_4_ = fVar283 * fVar199;
              auVar238._12_4_ = fVar284 * fVar199;
              local_9e0._0_16_ = auVar7;
              local_a00._0_4_ = auVar275._0_4_;
              if (fVar278 < -fVar278) {
                local_980._0_4_ = auVar114._0_4_;
                local_a60._0_16_ = auVar263;
                local_940._0_16_ = auVar238;
                local_960._0_16_ = auVar190;
                auVar274 = ZEXT1664(auVar110);
                fVar199 = sqrtf(fVar278);
                auVar231 = ZEXT464((uint)local_a00._0_4_);
                auVar114 = ZEXT416((uint)local_980._0_4_);
                auVar190 = local_960._0_16_;
                auVar238 = local_940._0_16_;
                auVar263 = local_a60._0_16_;
              }
              else {
                auVar275 = vsqrtss_avx(auVar5,auVar5);
                fVar199 = auVar275._0_4_;
              }
              auVar75._4_4_ = fStack_87c;
              auVar75._0_4_ = local_880;
              auVar75._8_4_ = fStack_878;
              auVar75._12_4_ = fStack_874;
              auVar275 = vdpps_avx(auVar75,auVar238,0x7f);
              auVar163 = vfmadd213ss_fma(ZEXT416((uint)local_900),auVar114,auVar231._0_16_);
              auVar5 = vdpps_avx(auVar263,auVar238,0x7f);
              auVar6 = vdpps_avx(auVar75,auVar190,0x7f);
              auVar7 = vdpps_avx(local_a80._0_16_,auVar238,0x7f);
              auVar218 = vfmadd213ss_fma(ZEXT416((uint)(auVar114._0_4_ + 1.0)),
                                         ZEXT416((uint)(local_900 / fVar199)),auVar163);
              auVar270 = ZEXT1664(auVar218);
              auVar120._0_4_ = auVar275._0_4_ * auVar275._0_4_;
              auVar120._4_4_ = auVar275._4_4_ * auVar275._4_4_;
              auVar120._8_4_ = auVar275._8_4_ * auVar275._8_4_;
              auVar120._12_4_ = auVar275._12_4_ * auVar275._12_4_;
              auVar114 = vdpps_avx(auVar75,auVar263,0x7f);
              auVar110 = vsubps_avx(auVar4,auVar120);
              auVar163 = vrsqrtss_avx(auVar110,auVar110);
              fVar213 = auVar110._0_4_;
              fVar199 = auVar163._0_4_;
              fVar199 = fVar199 * 1.5 + fVar213 * -0.5 * fVar199 * fVar199 * fVar199;
              auVar163 = vdpps_avx(auVar75,local_a80._0_16_,0x7f);
              local_980._0_16_ = ZEXT416((uint)(auVar5._0_4_ + auVar6._0_4_));
              auVar114 = vfnmadd231ss_fma(auVar114,auVar275,local_980._0_16_);
              auVar5 = vfnmadd231ss_fma(auVar163,auVar275,auVar7);
              if (fVar213 < 0.0) {
                local_a60._0_16_ = auVar275;
                local_940._0_4_ = auVar218._0_4_;
                local_960._0_16_ = auVar7;
                local_8a0._0_16_ = auVar114;
                local_8c0._0_4_ = fVar199;
                local_780._0_16_ = auVar5;
                auVar274 = ZEXT1664(auVar274._0_16_);
                fVar213 = sqrtf(fVar213);
                auVar270 = ZEXT464((uint)local_940._0_4_);
                auVar231 = ZEXT464((uint)local_a00._0_4_);
                fVar199 = (float)local_8c0._0_4_;
                auVar5 = local_780._0_16_;
                auVar114 = local_8a0._0_16_;
                auVar275 = local_a60._0_16_;
                auVar7 = local_960._0_16_;
              }
              else {
                auVar6 = vsqrtss_avx(auVar110,auVar110);
                fVar213 = auVar6._0_4_;
              }
              auVar243 = ZEXT1664(local_9e0._0_16_);
              auVar6 = vpermilps_avx(local_760._0_16_,0xff);
              fVar213 = fVar213 - auVar6._0_4_;
              auVar6 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
              auVar114 = vfmsub213ss_fma(auVar114,ZEXT416((uint)fVar199),auVar6);
              auVar191._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
              auVar191._8_4_ = auVar7._8_4_ ^ 0x80000000;
              auVar191._12_4_ = auVar7._12_4_ ^ 0x80000000;
              auVar206._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
              auVar206._8_4_ = auVar114._8_4_ ^ 0x80000000;
              auVar206._12_4_ = auVar114._12_4_ ^ 0x80000000;
              auVar163 = ZEXT416((uint)(auVar5._0_4_ * fVar199));
              auVar5 = vfmsub231ss_fma(ZEXT416((uint)(auVar7._0_4_ * auVar114._0_4_)),
                                       local_980._0_16_,auVar163);
              auVar114 = vinsertps_avx(auVar206,auVar163,0x1c);
              uVar104 = auVar5._0_4_;
              auVar207._4_4_ = uVar104;
              auVar207._0_4_ = uVar104;
              auVar207._8_4_ = uVar104;
              auVar207._12_4_ = uVar104;
              auVar114 = vdivps_avx(auVar114,auVar207);
              auVar5 = vinsertps_avx(local_980._0_16_,auVar191,0x10);
              auVar5 = vdivps_avx(auVar5,auVar207);
              fVar199 = auVar275._0_4_;
              auVar168._0_4_ = fVar199 * auVar114._0_4_ + fVar213 * auVar5._0_4_;
              auVar168._4_4_ = fVar199 * auVar114._4_4_ + fVar213 * auVar5._4_4_;
              auVar168._8_4_ = fVar199 * auVar114._8_4_ + fVar213 * auVar5._8_4_;
              auVar168._12_4_ = fVar199 * auVar114._12_4_ + fVar213 * auVar5._12_4_;
              auVar114 = vsubps_avx(auVar250,auVar168);
              auVar266 = ZEXT1664(auVar114);
              auVar250 = vandps_avx(auVar275,local_820._0_16_);
            } while (auVar270._0_4_ <= auVar250._0_4_);
            auVar275 = vfmadd231ss_fma(ZEXT416((uint)(auVar231._0_4_ + auVar270._0_4_)),
                                       local_7a0._0_16_,ZEXT416(0x36000000));
            auVar250 = vandps_avx(ZEXT416((uint)fVar213),local_820._0_16_);
          } while (auVar275._0_4_ <= auVar250._0_4_);
          fVar199 = auVar114._0_4_ + (float)local_860._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar199) &&
             (fVar213 = (ray->super_RayK<1>).tfar, fVar199 <= fVar213)) {
            auVar250 = vmovshdup_avx(auVar114);
            fVar215 = auVar250._0_4_;
            if ((0.0 <= fVar215) && (fVar215 <= 1.0)) {
              auVar250 = vrsqrtss_avx(auVar4,auVar4);
              fVar278 = auVar250._0_4_;
              pGVar9 = (context->scene->geometries).items[uVar98].ptr;
              if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar211 = fVar278 * 1.5 + fVar211 * -0.5 * fVar278 * fVar278 * fVar278;
                auVar192._0_4_ = fVar211 * local_880;
                auVar192._4_4_ = fVar211 * fStack_87c;
                auVar192._8_4_ = fVar211 * fStack_878;
                auVar192._12_4_ = fVar211 * fStack_874;
                auVar5 = vfmadd213ps_fma(auVar6,auVar192,local_9e0._0_16_);
                auVar250 = vshufps_avx(auVar192,auVar192,0xc9);
                auVar4 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                auVar193._0_4_ = auVar192._0_4_ * auVar4._0_4_;
                auVar193._4_4_ = auVar192._4_4_ * auVar4._4_4_;
                auVar193._8_4_ = auVar192._8_4_ * auVar4._8_4_;
                auVar193._12_4_ = auVar192._12_4_ * auVar4._12_4_;
                auVar275 = vfmsub231ps_fma(auVar193,local_9e0._0_16_,auVar250);
                auVar250 = vshufps_avx(auVar275,auVar275,0xc9);
                auVar4 = vshufps_avx(auVar5,auVar5,0xc9);
                auVar275 = vshufps_avx(auVar275,auVar275,0xd2);
                auVar121._0_4_ = auVar5._0_4_ * auVar275._0_4_;
                auVar121._4_4_ = auVar5._4_4_ * auVar275._4_4_;
                auVar121._8_4_ = auVar5._8_4_ * auVar275._8_4_;
                auVar121._12_4_ = auVar5._12_4_ * auVar275._12_4_;
                auVar4 = vfmsub231ps_fma(auVar121,auVar250,auVar4);
                auVar250 = vshufps_avx(auVar4,auVar4,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar199;
                  uVar109 = vmovlps_avx(auVar250);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar109;
                  (ray->Ng).field_0.field_0.z = auVar4._0_4_;
                  ray->u = fVar215;
                  ray->v = 0.0;
                  ray->primID = local_8e0._0_4_;
                  ray->geomID = uVar98;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_9b0 = vmovlps_avx(auVar250);
                  local_9a8 = auVar4._0_4_;
                  local_9a4 = fVar215;
                  local_9a0 = 0;
                  local_99c = local_8e0._0_4_;
                  local_998 = uVar98;
                  local_994 = context->user->instID[0];
                  local_990 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar199;
                  local_a84 = -1;
                  local_ab8.valid = &local_a84;
                  local_ab8.geometryUserPtr = pGVar9->userPtr;
                  local_ab8.context = context->user;
                  local_ab8.hit = (RTCHitN *)&local_9b0;
                  local_ab8.N = 1;
                  local_ab8.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012e7b5a:
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      auVar266 = ZEXT1664(auVar266._0_16_);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      auVar274 = ZEXT1664(auVar274._0_16_);
                      (*p_Var10)(&local_ab8);
                      if (*local_ab8.valid == 0) goto LAB_012e7bf6;
                    }
                    (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).components[0] =
                         *(float *)local_ab8.hit;
                    (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_ab8.hit + 4);
                    (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_ab8.hit + 8);
                    *(float *)((long)local_ab8.ray + 0x3c) = *(float *)(local_ab8.hit + 0xc);
                    *(float *)((long)local_ab8.ray + 0x40) = *(float *)(local_ab8.hit + 0x10);
                    *(float *)((long)local_ab8.ray + 0x44) = *(float *)(local_ab8.hit + 0x14);
                    *(float *)((long)local_ab8.ray + 0x48) = *(float *)(local_ab8.hit + 0x18);
                    *(float *)((long)local_ab8.ray + 0x4c) = *(float *)(local_ab8.hit + 0x1c);
                    *(float *)((long)local_ab8.ray + 0x50) = *(float *)(local_ab8.hit + 0x20);
                  }
                  else {
                    auVar243 = ZEXT1664(local_9e0._0_16_);
                    auVar266 = ZEXT1664(auVar114);
                    auVar270 = ZEXT1664(auVar270._0_16_);
                    auVar274 = ZEXT1664(auVar274._0_16_);
                    (*pGVar9->intersectionFilterN)(&local_ab8);
                    if (*local_ab8.valid != 0) goto LAB_012e7b5a;
LAB_012e7bf6:
                    (ray->super_RayK<1>).tfar = fVar213;
                  }
                }
              }
            }
          }
LAB_012e7a44:
          fVar199 = (ray->super_RayK<1>).tfar;
          auVar137._4_4_ = fVar199;
          auVar137._0_4_ = fVar199;
          auVar137._8_4_ = fVar199;
          auVar137._12_4_ = fVar199;
          auVar137._16_4_ = fVar199;
          auVar137._20_4_ = fVar199;
          auVar137._24_4_ = fVar199;
          auVar137._28_4_ = fVar199;
          fVar211 = (ray->super_RayK<1>).tfar;
          auVar122 = vcmpps_avx(_local_7c0,auVar137,2);
          auVar122 = vandps_avx(auVar122,local_700);
        }
        auVar176._0_4_ = local_840._0_4_ + local_580._0_4_;
        auVar176._4_4_ = local_840._4_4_ + local_580._4_4_;
        auVar176._8_4_ = local_840._8_4_ + local_580._8_4_;
        auVar176._12_4_ = local_840._12_4_ + local_580._12_4_;
        auVar176._16_4_ = local_840._16_4_ + local_580._16_4_;
        auVar176._20_4_ = local_840._20_4_ + local_580._20_4_;
        auVar176._24_4_ = local_840._24_4_ + local_580._24_4_;
        auVar176._28_4_ = local_840._28_4_ + local_580._28_4_;
        auVar197._4_4_ = fVar211;
        auVar197._0_4_ = fVar211;
        auVar197._8_4_ = fVar211;
        auVar197._12_4_ = fVar211;
        auVar197._16_4_ = fVar211;
        auVar197._20_4_ = fVar211;
        auVar197._24_4_ = fVar211;
        auVar197._28_4_ = fVar211;
        auVar126 = vcmpps_avx(auVar176,auVar197,2);
        auVar122 = vandps_avx(local_680,local_660);
        auVar122 = vandps_avx(auVar126,auVar122);
        auVar210._0_4_ = local_840._0_4_ + local_5c0._0_4_;
        auVar210._4_4_ = local_840._4_4_ + local_5c0._4_4_;
        auVar210._8_4_ = local_840._8_4_ + local_5c0._8_4_;
        auVar210._12_4_ = local_840._12_4_ + local_5c0._12_4_;
        auVar210._16_4_ = local_840._16_4_ + local_5c0._16_4_;
        auVar210._20_4_ = local_840._20_4_ + local_5c0._20_4_;
        auVar210._24_4_ = local_840._24_4_ + local_5c0._24_4_;
        auVar210._28_4_ = local_840._28_4_ + local_5c0._28_4_;
        auVar273 = vcmpps_avx(auVar210,auVar197,2);
        auVar126 = vandps_avx(_local_800,local_7e0);
        auVar126 = vandps_avx(auVar273,auVar126);
        auVar126 = vorps_avx(auVar122,auVar126);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0x7f,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar126 >> 0xbf,0) != '\0') ||
            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar126[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar100 * 0x60) = auVar126;
          auVar122 = vblendvps_avx(_local_5c0,local_580,auVar122);
          *(undefined1 (*) [32])(auStack_160 + uVar100 * 0x60) = auVar122;
          uVar15 = vmovlps_avx(local_5d0);
          (&uStack_140)[uVar100 * 0xc] = uVar15;
          aiStack_138[uVar100 * 0x18] = local_b2c + 1;
          uVar100 = (ulong)((int)uVar100 + 1);
        }
        uVar104 = local_8e0._0_4_;
      }
    }
    fVar199 = (ray->super_RayK<1>).tfar;
    auVar153._4_4_ = fVar199;
    auVar153._0_4_ = fVar199;
    auVar153._8_4_ = fVar199;
    auVar153._12_4_ = fVar199;
    auVar153._16_4_ = fVar199;
    auVar153._20_4_ = fVar199;
    auVar153._24_4_ = fVar199;
    auVar153._28_4_ = fVar199;
    while( true ) {
      uVar97 = (uint)uVar100;
      if (uVar97 == 0) {
        auVar122 = vcmpps_avx(local_340,auVar153,2);
        uVar98 = vmovmskps_avx(auVar122);
        uVar105 = (ulong)((uint)uVar105 & uVar98);
        goto LAB_012e5787;
      }
      uVar100 = (ulong)(uVar97 - 1);
      lVar101 = uVar100 * 0x60;
      auVar122 = *(undefined1 (*) [32])(auStack_160 + lVar101);
      auVar131._0_4_ = auVar231._0_4_ + auVar122._0_4_;
      auVar131._4_4_ = auVar231._4_4_ + auVar122._4_4_;
      auVar131._8_4_ = auVar231._8_4_ + auVar122._8_4_;
      auVar131._12_4_ = auVar231._12_4_ + auVar122._12_4_;
      auVar131._16_4_ = auVar231._16_4_ + auVar122._16_4_;
      auVar131._20_4_ = auVar231._20_4_ + auVar122._20_4_;
      auVar131._24_4_ = auVar231._24_4_ + auVar122._24_4_;
      auVar131._28_4_ = auVar231._28_4_ + auVar122._28_4_;
      auVar273 = vcmpps_avx(auVar131,auVar153,2);
      auVar126 = vandps_avx(auVar273,*(undefined1 (*) [32])(auStack_180 + lVar101));
      local_580 = auVar126;
      auVar273 = *(undefined1 (*) [32])(auStack_180 + lVar101) & auVar273;
      if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar273 >> 0x7f,0) != '\0') ||
            (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar273 >> 0xbf,0) != '\0') ||
          (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar273[0x1f] < '\0') break;
      uVar100 = (ulong)(uVar97 - 1);
    }
    auVar154._8_4_ = 0x7f800000;
    auVar154._0_8_ = 0x7f8000007f800000;
    auVar154._12_4_ = 0x7f800000;
    auVar154._16_4_ = 0x7f800000;
    auVar154._20_4_ = 0x7f800000;
    auVar154._24_4_ = 0x7f800000;
    auVar154._28_4_ = 0x7f800000;
    auVar122 = vblendvps_avx(auVar154,auVar122,auVar126);
    auVar273 = vshufps_avx(auVar122,auVar122,0xb1);
    auVar273 = vminps_avx(auVar122,auVar273);
    auVar11 = vshufpd_avx(auVar273,auVar273,5);
    auVar273 = vminps_avx(auVar273,auVar11);
    auVar11 = vpermpd_avx2(auVar273,0x4e);
    auVar273 = vminps_avx(auVar273,auVar11);
    auVar122 = vcmpps_avx(auVar122,auVar273,0);
    auVar273 = auVar126 & auVar122;
    if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar273 >> 0x7f,0) != '\0') ||
          (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar273 >> 0xbf,0) != '\0') ||
        (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar273[0x1f] < '\0') {
      auVar126 = vandps_avx(auVar122,auVar126);
    }
    uVar102 = vmovmskps_avx(auVar126);
    iVar14 = 0;
    for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x80000000) {
      iVar14 = iVar14 + 1;
    }
    *(undefined4 *)(local_580 + (uint)(iVar14 << 2)) = 0;
    uVar15 = (&uStack_140)[uVar100 * 0xc];
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar15;
    local_b2c = aiStack_138[uVar100 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar101) = local_580;
    uVar102 = uVar97 - 1;
    if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_580 >> 0x7f,0) != '\0') ||
          (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_580 >> 0xbf,0) != '\0') ||
        (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_580[0x1f] < '\0') {
      uVar102 = uVar97;
    }
    uVar108 = (undefined4)uVar15;
    auVar155._4_4_ = uVar108;
    auVar155._0_4_ = uVar108;
    auVar155._8_4_ = uVar108;
    auVar155._12_4_ = uVar108;
    auVar155._16_4_ = uVar108;
    auVar155._20_4_ = uVar108;
    auVar155._24_4_ = uVar108;
    auVar155._28_4_ = uVar108;
    auVar250 = vmovshdup_avx(auVar112);
    auVar250 = vsubps_avx(auVar250,auVar112);
    auVar132._0_4_ = auVar250._0_4_;
    auVar132._4_4_ = auVar132._0_4_;
    auVar132._8_4_ = auVar132._0_4_;
    auVar132._12_4_ = auVar132._0_4_;
    auVar132._16_4_ = auVar132._0_4_;
    auVar132._20_4_ = auVar132._0_4_;
    auVar132._24_4_ = auVar132._0_4_;
    auVar132._28_4_ = auVar132._0_4_;
    auVar250 = vfmadd132ps_fma(auVar132,auVar155,_DAT_01f7b040);
    _local_5c0 = ZEXT1632(auVar250);
    local_5d0._8_8_ = 0;
    local_5d0._0_8_ = *(ulong *)(local_5c0 + (uint)(iVar14 << 2));
    uVar100 = (ulong)uVar102;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }